

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O3

void lj_asm_trace(jit_State *J,GCtrace *T)

{
  char *pcVar1;
  anon_struct_8_4_c535eab0_for_IRIns_0 aVar2;
  char cVar3;
  uint8_t uVar4;
  short sVar5;
  CTypeID id;
  ExitNo exitno;
  SnapShot *pSVar6;
  uint64_t uVar7;
  SnapEntry *pSVar8;
  GCtrace *T_00;
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  MCode *pMVar15;
  ushort uVar16;
  CTInfo CVar17;
  int iVar18;
  Reg RVar19;
  TRef TVar20;
  MCode *p_1;
  Reg RVar25;
  uint uVar26;
  GCtrace *pGVar21;
  IRIns *pIVar22;
  byte *pbVar23;
  MCode MVar24;
  undefined4 uVar27;
  MCode *p;
  long lVar28;
  ushort *puVar29;
  void *addr;
  code *pcVar30;
  ushort uVar31;
  BCReg BVar32;
  x86Shift xs;
  IRCallID id_00;
  IRRef IVar33;
  undefined4 uVar34;
  ulong uVar35;
  IRIns u64;
  IRIns IVar36;
  byte *pbVar37;
  x86Op xVar38;
  byte *pbVar39;
  uint *u64_00;
  IRIns *pIVar40;
  CCallInfo *pCVar41;
  ulong uVar42;
  int iVar43;
  uint uVar44;
  IRIns IVar45;
  byte bVar46;
  IRRef1 IVar47;
  uint uVar48;
  BCReg BVar49;
  MSize MVar50;
  code *target;
  uint16_t *puVar51;
  int32_t iVar52;
  long lVar53;
  MCode MVar54;
  MCode MVar55;
  byte bVar56;
  uint uVar57;
  SnapEntry sn;
  RegSet RVar58;
  byte bVar59;
  bool bVar60;
  bool bVar61;
  CTSize sz;
  IRRef args [64];
  ushort auStack_10372 [32545];
  code *pcStack_530;
  IRIns local_528;
  uint local_520;
  int local_51c;
  ulong local_518;
  IRIns *local_510;
  undefined1 local_508 [172];
  RegSet RStack_45c;
  uint uStack_458;
  uint uStack_454;
  uint32_t local_450;
  int local_44c;
  uint local_448;
  uint local_444;
  IRRef local_440;
  uint local_43c;
  uint local_438;
  uint local_434;
  uint local_430;
  uint local_42c;
  uint local_428;
  int local_424;
  IRRef local_410;
  IRRef local_40c;
  IRRef local_408;
  undefined8 local_404;
  GCtrace *local_3f8;
  GCtrace *local_3f0;
  MCode *local_3e8;
  byte *local_3e0;
  byte *local_3d8;
  byte *local_3d0;
  undefined1 local_3c8 [16];
  byte *local_3b8;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  ushort local_370 [252];
  IRIns *local_178;
  uint local_16c;
  IRIns local_168;
  uint32_t local_160;
  ulong local_158;
  jit_State *local_150;
  GCtrace *local_148;
  global_State *local_140;
  TValue local_138;
  uint32_t local_130;
  undefined4 local_12c;
  
  uVar35 = (ulong)(T->nins - 1);
  cVar3 = *(char *)((long)T->ir + uVar35 * 8 + 5);
  if ((cVar3 == '\x14') || (cVar3 == '\f')) {
    while ((cVar3 = *(char *)((long)T->ir + uVar35 * 8 + -3), cVar3 == '\x14' || (cVar3 == '\f'))) {
      uVar35 = uVar35 - 1;
    }
    T->nins = (IRRef)uVar35;
  }
  uVar44 = (J->cur).nins;
  if (J->irtoplim <= uVar44) {
    pcStack_530 = (code *)0x13b87a;
    lj_ir_growtop(J);
  }
  (J->cur).nins = uVar44 + 1;
  (J->cur).ir[uVar44] = (IRIns)0xc0000000000;
  pcStack_530 = (code *)0x136373;
  local_508._152_8_ = J;
  local_438 = uVar44;
  local_3f8 = T;
  pGVar21 = lj_trace_alloc(J->L,T);
  J->curfinal = pGVar21;
  local_450 = J->flags;
  local_408 = J->loopref;
  local_3b8 = (byte *)0x0;
  local_44c = 0;
  if ((ulong)J->parent == 0) {
    local_3f0 = (GCtrace *)0x0;
  }
  else {
    local_3f0 = (GCtrace *)J->trace[J->parent].gcptr64;
  }
  pcStack_530 = (code *)0x1363dc;
  local_508._128_8_ = lj_mcode_reserve(J,&local_3e8);
  local_3d8 = (byte *)local_508._128_8_;
  local_3e0 = (byte *)local_508._128_8_;
  local_508._136_8_ = local_3e8 + 0x40;
  uVar16 = local_3f8->nsnap;
  if (0x1ff < uVar16) {
    pcStack_530 = (code *)0x13b8d9;
    lj_trace_err((jit_State *)local_508._152_8_,LJ_TRERR_SNAPOV);
  }
  if (uVar16 != 0) {
    MVar24 = '\x01';
    uVar35 = 0;
    do {
      pMVar15 = local_3e8;
      if (((MCode **)(local_508._152_8_ + 0x6a0))[uVar35] == (MCode *)0x0) {
        if ((ulong)local_508._128_8_ <= local_3e8 + 0x8d) goto LAB_0013b6a3;
        *local_3e8 = 'j';
        local_3e8[1] = (MCode)((int)uVar35 << 5);
        MVar54 = 'z';
        lVar28 = 0;
        MVar55 = MVar24;
        do {
          lVar53 = lVar28;
          local_3e8[lVar53 + 2] = 0xeb;
          local_3e8[lVar53 + 3] = MVar54;
          local_3e8[lVar53 + 4] = 'j';
          local_3e8[lVar53 + 5] = MVar55;
          MVar55 = MVar55 + '\x01';
          MVar54 = MVar54 + 0xfc;
          lVar28 = lVar53 + 4;
        } while ((int)(lVar53 + 4) != 0x7c);
        local_3e8[lVar53 + 6] = 'j';
        local_3e8[lVar53 + 7] = (MCode)(uVar35 >> 3);
        local_3e8[lVar53 + 8] = 0xe9;
        *(int *)(local_3e8 + lVar53 + 9) = 0x12ee5c - (int)local_3e8;
        *(MCode **)(local_508._152_8_ + 0xbf8) = local_3e8 + lVar53 + 0xd;
        local_3e8 = local_3e8 + lVar53 + 0xd;
        local_508._136_8_ = pMVar15 + lVar53 + 0x4d;
        ((MCode **)(local_508._152_8_ + 0x6a0))[uVar35] = pMVar15;
      }
      uVar35 = uVar35 + 1;
      MVar24 = MVar24 + ' ';
    } while (uVar35 != uVar16 + 0x1f >> 5);
  }
  local_508._164_2_ = local_508._164_2_ & 0xff00;
  local_140 = (global_State *)(J[-1].penalty + 0x23);
  pGVar21 = J->curfinal;
  local_148 = T;
  local_150 = J;
LAB_0013654a:
  local_508._144_8_ = pGVar21->ir;
  (J->cur).nins = local_438;
  local_440 = local_438;
  pbVar39 = local_3e0;
  if (local_3b8 != (byte *)0x0) {
    if (((ulong)local_3b8 & 0xf) != 0) {
      pbVar39 = local_3e0 + (int)-((uint)local_3b8 & 0xf);
      pcStack_530 = (code *)0x136599;
      memset(pbVar39,0x90,(ulong)((uint)local_3b8 & 0xf));
    }
    local_3e0 = pbVar39;
    pbVar39 = pbVar39 + (ulong)(local_44c == 0) * 3;
  }
  local_3c8._0_8_ = pbVar39 + -5;
  local_508._128_8_ = local_3c8._0_8_;
  if (local_408 == 0) {
    local_3c8._0_8_ = (byte *)0x0;
    local_508._128_8_ = pbVar39 + -0xc;
  }
  local_3d0 = (byte *)0x0;
  local_3c8._8_8_ = 0;
  local_404._0_4_ = 0;
  local_404._4_4_ = 0;
  local_40c = local_408;
  local_410 = local_408;
  if ((local_450 >> 0x19 & 1) == 0) {
    local_410 = 0xffffffff;
  }
  uVar4 = local_3f8->sinktags;
  local_440 = local_3f8->nins;
  uVar35 = (ulong)local_440;
  stack0xfffffffffffffba0 = ZEXT416(0xffffbfef);
  local_380 = (undefined1  [16])0x0;
  local_390 = (undefined1  [16])0x0;
  local_3a0 = (undefined1  [16])0x0;
  local_3b0 = (undefined1  [16])0x0;
  lVar28 = 0;
  do {
    *(undefined8 *)(local_508 + lVar28 * 4) = 0xffff0000ffff0000;
    *(undefined8 *)(local_508 + lVar28 * 4 + 8) = 0xffff0000ffff0000;
    lVar28 = lVar28 + 4;
  } while (lVar28 != 0x20);
  if ((ulong)local_3f8->nk < 0x8000) {
    lVar28 = (ulong)local_3f8->nk << 3;
    do {
      *(undefined2 *)(local_508._144_8_ + lVar28 + 6) = 0xff;
      if (((0x605fd9U >> (*(uint *)(local_508._144_8_ + lVar28 + 4) & 0x1f) & 1) != 0) &&
         (*(char *)(local_508._144_8_ + lVar28 + 5) != '\x1b')) {
        *(undefined4 *)(local_508._144_8_ + lVar28) = 0;
        lVar28 = lVar28 + 8;
      }
      bVar61 = lVar28 < 0x3fff8;
      lVar28 = lVar28 + 8;
    } while (bVar61);
  }
  *(undefined2 *)(local_508._144_8_ + 0x40006) = 0x82;
  local_430 = local_440;
  local_434 = local_440;
  local_42c = (uint)local_3f8->nsnap;
  local_424 = 0;
  local_43c = 0x8000;
  local_438 = local_440;
  pIVar40 = (IRIns *)(local_508._144_8_ + 0x40008);
  if (local_3f0 != (GCtrace *)0x0) {
    pcStack_530 = (code *)0x13674a;
    pIVar22 = lj_snap_regspmap((jit_State *)local_508._152_8_,local_3f0,
                               *(ExitNo *)(local_508._152_8_ + 0xbcc),pIVar40);
    if (2000 < (long)pIVar22 - (long)pIVar40) {
LAB_0013b87f:
      pcStack_530 = (code *)0x13b891;
      lj_trace_err((jit_State *)local_508._152_8_,LJ_TRERR_NYICOAL);
    }
    local_43c = (uint)((ulong)((long)pIVar22 + (-8 - local_508._144_8_)) >> 3);
    if (pIVar40 < pIVar22) {
      puVar29 = local_370;
      do {
        uVar16 = (pIVar40->field_0).prev;
        *puVar29 = uVar16;
        puVar29 = puVar29 + 1;
        IVar47 = uVar16 | 0x80;
        if (0xff < uVar16) {
          IVar47 = 0xff;
        }
        (pIVar40->field_0).prev = IVar47;
        pIVar40 = pIVar40 + 1;
      } while (pIVar40 < pIVar22);
    }
  }
  local_448 = 2;
  pIVar22 = (IRIns *)(local_508._144_8_ + uVar35 * 8);
  if (pIVar40 < pIVar22) {
    bVar61 = false;
LAB_001367e1:
    if (uVar4 != '\0') {
      if ((pIVar40->field_1).r != 0xfe) {
        if ((pIVar40->field_1).r != 0xfd) goto LAB_00136807;
        (pIVar40->field_1).r = 0xfe;
      }
      goto LAB_00136aa5;
    }
LAB_00136807:
    uVar35 = local_508._168_8_;
    switch((pIVar40->field_1).o) {
    case '\x10':
      uVar44 = *(byte *)((long)pIVar40 + -3) - 0x5f;
      if ((4 < uVar44) || (uVar44 == 1)) goto switchD_0013681f_caseD_42;
      *(undefined2 *)((long)pIVar40 + -2) = 0x80;
      (pIVar40->field_0).prev = 0x82;
      break;
    case '\x11':
switchD_0013681f_caseD_11:
      bVar61 = true;
      goto switchD_0013681f_caseD_42;
    default:
      uVar16 = (pIVar40->field_0).op2;
LAB_00136a5e:
      if ((((short)uVar16 < 0) || (-1 < (short)(pIVar40->field_0).op1)) ||
         (IVar47 = *(IRRef1 *)(local_508._144_8_ + (ulong)(pIVar40->field_0).op1 * 8 + 6),
         0xfc < (byte)IVar47)) goto switchD_0013681f_caseD_42;
      (pIVar40->field_0).prev = IVar47;
      break;
    case '$':
    case '%':
    case '&':
      if ((local_450 & 0x40) == 0) goto switchD_0013681f_caseD_27;
      goto switchD_0013681f_caseD_42;
    case '\'':
    case '(':
switchD_0013681f_caseD_27:
      uVar16 = (pIVar40->field_0).op2;
      if (((short)uVar16 < 0) && (0xfc < *(byte *)(local_508._144_8_ + (ulong)uVar16 * 8 + 6))) {
        *(undefined1 *)(local_508._144_8_ + (ulong)uVar16 * 8 + 6) = 0x81;
        if (bVar61) {
          stack0xfffffffffffffba0 = local_508._168_5_ | 0x200000000;
          bVar61 = true;
        }
        else {
          bVar61 = false;
        }
      }
      goto switchD_0013681f_caseD_42;
    case ',':
    case '-':
switchD_0013681f_caseD_2c:
      if (((pIVar40->field_1).t.irt & 0x1f) == 0xe) goto switchD_0013681f_caseD_42;
      (pIVar40->field_0).prev = 0x80;
      if (!bVar61) goto LAB_00136a3b;
      stack0xfffffffffffffba0 = uVar35 | 0xfc700000000;
LAB_0013683c:
      bVar61 = true;
      break;
    case '.':
      if (((pIVar40->field_1).t.irt & 0x1f) != 0xe) goto switchD_0013681f_caseD_2c;
LAB_00136a40:
      if (bVar61) {
        stack0xfffffffffffffba0 = uVar35 | 0xffff0fc700000000;
      }
      (pIVar40->field_0).prev = 0x90;
      break;
    case '4':
      if (2 < (pIVar40->field_0).op2) goto LAB_00136a40;
      if ((local_450 & 0x20) == 0) {
        (pIVar40->field_0).prev = 0x90;
        if (!bVar61) goto LAB_00136a3b;
        stack0xfffffffffffffba0 = uVar35 | 0xf000100000000;
        goto LAB_0013683c;
      }
      goto switchD_0013681f_caseD_42;
    case ';':
    case 'O':
    case 'P':
    case 'Q':
    case 'R':
    case 'S':
    case 'T':
    case 'V':
    case 'W':
    case ']':
      (pIVar40->field_0).prev = 0x80;
      if (bVar61) {
        RStack_45c = 0xffff0fc7;
        goto LAB_0013683c;
      }
LAB_00136a3b:
      bVar61 = false;
      break;
    case 'B':
    case 'C':
    case 'D':
    case 'F':
    case 'H':
    case '\\':
      goto switchD_0013681f_caseD_42;
    case 'Y':
    case '^':
      if (bVar61) {
        RStack_45c = 0xffff0fc7;
        goto switchD_0013681f_caseD_11;
      }
      bVar61 = false;
      goto switchD_0013681f_caseD_42;
    case '[':
      if ((1 < (byte)(((pIVar40->field_1).t.irt & 0x1f) - 0xd)) &&
         (uVar16 = (pIVar40->field_0).op2, 1 < (ushort)((uVar16 & 0x1f) - 0xd))) goto LAB_00136a5e;
switchD_0013681f_caseD_42:
      (pIVar40->field_0).prev = 0xff;
      break;
    case '_':
    case '`':
    case 'b':
      goto switchD_0013681f_caseD_5f;
    case 'a':
      if (((pIVar40->field_0).op2 == 0x25) && ((int)local_448 < 4)) {
        local_448 = 4;
      }
      goto switchD_0013681f_caseD_5f;
    case 'c':
      pcStack_530 = (code *)0x1369d2;
      local_130 = asm_callx_flags((ASMState *)local_508,pIVar40);
      pcStack_530 = (code *)0x1369ec;
      RVar25 = asm_setup_call_slots((ASMState *)local_508,pIVar40,(CCallInfo *)&local_138.gcr);
      (pIVar40->field_0).prev = (IRRef1)RVar25;
      if (bVar61) {
        stack0xfffffffffffffba0 = local_508._168_8_ | 0xffff0fc700000000;
      }
    }
    goto LAB_00136aa5;
  }
  goto LAB_00136abd;
switchD_0013681f_caseD_5f:
  uVar16 = (pIVar40->field_0).op2;
  pcStack_530 = (code *)0x1368f5;
  RVar25 = asm_setup_call_slots((ASMState *)local_508,pIVar40,lj_ir_callinfo + uVar16);
  (pIVar40->field_0).prev = (IRRef1)RVar25;
  if (bVar61) {
    RStack_45c = RStack_45c |
                 (uint)((*(byte *)((long)&lj_ir_callinfo[uVar16].flags + 1) & 4) >> 2) * 0x10000 -
                 0xf039;
  }
  else {
    bVar61 = false;
  }
LAB_00136aa5:
  uVar44 = local_448;
  pIVar40 = pIVar40 + 1;
  if (pIVar22 <= pIVar40) goto code_r0x00136ab2;
  goto LAB_001367e1;
code_r0x00136ab2:
  if ((local_448 & 1) == 0) {
LAB_00136abd:
    uVar44 = 0;
  }
  else {
    local_448 = local_448 + 1;
  }
  local_444 = uVar44;
  if (local_408 == 0) {
    uVar42 = (ulong)(local_3f8->nsnap - 1);
    pSVar6 = local_3f8->snap;
    uVar35 = (ulong)pSVar6[uVar42].nent;
    if (uVar35 == 0) {
      uVar26 = 0;
      uVar44 = 0;
    }
    else {
      do {
        if ((local_3f8->snapmap[(ulong)pSVar6[uVar42].mapofs + (uVar35 - 1)] >> 0x10 & 1) != 0) {
          uVar44 = (local_3f8->snapmap[(ulong)pSVar6[uVar42].mapofs + (uVar35 - 1)] >> 0x18) - 1;
          uVar26 = (uint)CONCAT71((int7)((ulong)pIVar40 >> 8),1);
          goto LAB_00136b41;
        }
        uVar35 = uVar35 - 1;
      } while (uVar35 != 0);
      uVar26 = 0;
      uVar44 = 0;
    }
LAB_00136b41:
    pSVar6 = pSVar6 + uVar42;
    local_404._0_4_ = (uint)pSVar6->topslot;
    if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_0013b6a3;
    pcStack_530 = (code *)0x136b7b;
    ra_allocref((ASMState *)local_508,0x8000,4);
    if (local_3f8->link == 0) {
      u64_00 = (uint *)(*(ulong *)(local_3f8->snapmap + ((uint)pSVar6->nent + pSVar6->mapofs)) >> 8)
      ;
      if (((char)*u64_00 == 'W') &&
         (uVar7 = (*(GCRef **)(local_508._152_8_ + 0x180))[*u64_00 >> 0x10].gcptr64,
         0xfffffffb < *(byte *)(uVar7 + 0x50) - 0x4d)) {
        u64_00 = (uint *)(uVar7 + 0x50);
      }
      pcStack_530 = (code *)0x136c11;
      emit_loadu64((ASMState *)local_508,3,(uint64_t)u64_00);
      iVar43 = ~uVar44 + (uint)pSVar6->nslots;
      uVar57 = *u64_00;
      uVar48 = (uVar57 & 0xff) - 0x3f;
      uVar48 = uVar48 >> 1 | (uint)((uVar48 & 1) != 0) << 0x1f;
      if (uVar48 - 1 < 2) {
        iVar43 = (iVar43 - ((uVar57 >> 0x10 & 0xff) + (uVar57 >> 8 & 0xff))) + -2;
LAB_00136c5d:
        if (iVar43 == 0) goto LAB_00136c78;
LAB_00136c89:
        *(int *)(local_508._128_8_ + -4) = iVar43;
        *(byte *)(local_508._128_8_ + -5) = 0xb8;
        local_508._128_8_ = local_508._128_8_ + -5;
      }
      else {
        if (uVar48 == 0) {
          uVar48 = uVar57 >> 8 & 0xff;
LAB_00136c5b:
          iVar43 = iVar43 - uVar48;
          goto LAB_00136c5d;
        }
        if (uVar48 == 5) {
          uVar48 = (uVar57 >> 0x10) + (uVar57 >> 8 & 0xff);
          goto LAB_00136c5b;
        }
        if (0x58 < (uVar57 & 0xff)) goto LAB_00136c5d;
LAB_00136c78:
        if ((*(byte *)local_508._128_8_ != 0xf) && ((*(byte *)local_508._128_8_ & 0xf0) == 0x70)) {
          iVar43 = 0;
          goto LAB_00136c89;
        }
        ((byte *)(local_508._128_8_ + -2))[0] = 0x33;
        ((byte *)(local_508._128_8_ + -2))[1] = 0xc0;
        local_508._128_8_ = local_508._128_8_ + -2;
      }
LAB_00136cae:
      if (uVar44 != 0) {
        iVar43 = uVar44 * 8;
        if ((char)(byte)iVar43 == iVar43) {
          *(byte *)(local_508._128_8_ + -1) = (byte)iVar43;
          local_508._128_8_ = local_508._128_8_ + -1;
          uVar34 = 0x830000fe;
        }
        else {
          *(int *)(local_508._128_8_ + -4) = iVar43;
          local_508._128_8_ = local_508._128_8_ + -4;
          uVar34 = 0x810000fe;
        }
        *(byte *)(local_508._128_8_ + -1) = 0xc2;
        *(undefined4 *)(local_508._128_8_ + -5) = uVar34;
        *(byte *)(local_508._128_8_ + -3) = 0x48;
        local_508._128_8_ = (byte *)(local_508._128_8_ + -3);
      }
    }
    else if (uVar44 != 0) {
      pcStack_530 = (code *)0x136bb8;
      emit_rma((ASMState *)local_508,XO_MOVto,0x80202,
               &((jit_State *)(local_508._152_8_ + -0xc28))->penalty[0x3a].val);
      goto LAB_00136cae;
    }
    if ((ulong)*(IRRef1 *)(local_508._152_8_ + 400) != 0) {
      *(IRIns *)(local_508._144_8_ + ((ulong)*(IRRef1 *)(local_508._152_8_ + 400) + 1) * 8) =
           *(IRIns *)(local_508._152_8_ + 0x78);
      *(undefined1 *)(local_508._144_8_ + (ulong)*(IRRef1 *)(local_508._152_8_ + 400) * 8 + 5) =
           0x18;
    }
    IVar36.gcr.gcptr64._1_7_ = 0;
    IVar36.field_0.op1._0_1_ = pSVar6->nent;
    local_520 = uVar26;
    local_518 = uVar42;
    if (IVar36 != (IRIns)0x0) {
      uVar44 = pSVar6->mapofs;
      pSVar8 = local_3f8->snapmap;
      IVar45 = (IRIns)0x0;
      local_528 = IVar36;
      do {
        uVar26 = pSVar8[(ulong)uVar44 + (long)IVar45];
        if ((uVar26 >> 0x12 & 1) == 0) {
          iVar43 = (uVar26 >> 0x18) * 8 + -0x10;
          uVar57 = (uVar26 >> 0x18) * 8;
          uVar48 = uVar26 & 0xffff;
          pIVar40 = (IRIns *)((ulong)(uVar48 * 8) + local_508._144_8_);
          bVar56 = (byte)iVar43;
          if ((uVar26 >> 0x14 & 1) == 0) {
            if (((pIVar40->field_1).t.irt & 0x1f) == 0xe) {
              RVar25 = (Reg)(char)(pIVar40->field_1).r;
              if ((char)(pIVar40->field_1).r < '\0') {
                pcStack_530 = (code *)0x136dc5;
                RVar25 = ra_allocref((ASMState *)local_508,uVar48,0xffff0000);
              }
              bVar56 = (byte)RVar25 & 0x1f;
              uStack_458 = uStack_458 & (-2 << bVar56 | 0xfffffffeU >> 0x20 - bVar56);
              xVar38 = XO_MOVSDto;
            }
            else {
              if (uVar48 < 0x8000) {
                pcStack_530 = (code *)0x136e3e;
                lj_ir_kvalue(*(lua_State **)(local_508._152_8_ + 0x80),&local_138,pIVar40);
                lVar28 = CONCAT26(local_138.u64._6_2_,
                                  CONCAT24(local_138.u64._4_2_,local_138.field_4.i));
                IVar36 = local_528;
                if (lVar28 == -1) {
                  pbVar39 = (byte *)(local_508._128_8_ + -4);
                  pbVar39[0] = 0xff;
                  pbVar39[1] = 0xff;
                  pbVar39[2] = 0xff;
                  pbVar39[3] = 0xff;
                  if (iVar43 == 0) {
                    local_508._128_8_ = local_508._128_8_ + -4;
                    bVar56 = 2;
                  }
                  else if (uVar26 < 0x12000000) {
                    *(byte *)(local_508._128_8_ + -5) = bVar56;
                    local_508._128_8_ = local_508._128_8_ + -5;
                    bVar56 = 0x42;
                  }
                  else {
                    *(int *)(local_508._128_8_ + -8) = iVar43;
                    local_508._128_8_ = local_508._128_8_ + -8;
                    bVar56 = 0x82;
                  }
                  *(byte *)(local_508._128_8_ + -1) = bVar56;
                  *(byte *)(local_508._128_8_ + -3) = 0x48;
                  *(byte *)(local_508._128_8_ + -2) = 199;
                  local_508._128_8_ = local_508._128_8_ + -3;
                  goto LAB_00137108;
                }
                *(int *)(local_508._128_8_ + -4) = (int)((ulong)lVar28 >> 0x20);
                if (uVar57 < 0x8c) {
                  *(byte *)(local_508._128_8_ + -5) = (byte)(uVar57 - 0xc);
                  ((byte *)(local_508._128_8_ + -7))[0] = 199;
                  ((byte *)(local_508._128_8_ + -7))[1] = 0x42;
                  *(int32_t *)(local_508._128_8_ + -0xb) = local_138.field_4.i;
                  if (iVar43 != 0) {
                    pbVar39 = (byte *)(local_508._128_8_ + -5);
                    goto LAB_00137059;
                  }
                  pbVar39 = (byte *)(local_508._128_8_ + -0xb);
                  bVar56 = 2;
                }
                else {
                  pbVar39 = (byte *)(local_508._128_8_ + -8);
                  *(uint *)(local_508._128_8_ + -8) = uVar57 - 0xc;
                  ((byte *)(local_508._128_8_ + -10))[0] = 199;
                  ((byte *)(local_508._128_8_ + -10))[1] = 0x82;
                  *(int32_t *)(local_508._128_8_ + -0xe) = local_138.field_4.i;
LAB_00137059:
                  if (uVar26 < 0x12000000) {
                    pbVar39[-7] = bVar56;
                    pbVar39 = pbVar39 + -7;
                    bVar56 = 0x42;
                  }
                  else {
                    *(int *)(pbVar39 + -10) = iVar43;
                    pbVar39 = pbVar39 + -10;
                    bVar56 = 0x82;
                  }
                }
                pbVar39[-1] = bVar56;
                pbVar39[-2] = 199;
                local_508._128_8_ = pbVar39 + -2;
                goto LAB_00137108;
              }
              RVar25 = (Reg)(char)(pIVar40->field_1).r;
              if ((char)(pIVar40->field_1).r < '\0') {
                pcStack_530 = (code *)0x136f50;
                RVar25 = ra_allocref((ASMState *)local_508,uVar48,0xbfeb);
              }
              bVar56 = (byte)RVar25 & 0x1f;
              uStack_458 = uStack_458 & (-2 << bVar56 | 0xfffffffeU >> 0x20 - bVar56);
              uVar26 = (pIVar40->field_1).t.irt & 0x1f;
              uVar48 = ~uVar26;
              if ((0x605fd9U >> uVar26 & 1) == 0) {
                *(uint *)(local_508._128_8_ + -4) = uVar48 << 0xf | 0x7fff;
                if (uVar57 < 0x8c) {
                  *(byte *)(local_508._128_8_ + -5) = (byte)(uVar57 - 0xc);
                  local_508._128_8_ = local_508._128_8_ + -5;
                  bVar56 = 199;
                  bVar59 = 0x42;
                }
                else {
                  *(uint *)(local_508._128_8_ + -8) = uVar57 - 0xc;
                  local_508._128_8_ = local_508._128_8_ + -8;
                  bVar56 = 199;
                  bVar59 = 0x82;
                }
              }
              else {
                *(uint *)(local_508._128_8_ + -4) = uVar48 << 0xf;
                if (uVar57 < 0x8c) {
                  *(byte *)(local_508._128_8_ + -5) = (byte)(uVar57 - 0xc);
                  local_508._128_8_ = local_508._128_8_ + -5;
                  bVar56 = 0x81;
                  bVar59 = 0x4a;
                }
                else {
                  *(uint *)(local_508._128_8_ + -8) = uVar57 - 0xc;
                  local_508._128_8_ = local_508._128_8_ + -8;
                  bVar56 = 0x81;
                  bVar59 = 0x8a;
                }
              }
              *(byte *)(local_508._128_8_ + -1) = bVar59;
              *(byte *)(local_508._128_8_ + -2) = bVar56;
              local_508._128_8_ = local_508._128_8_ + -2;
              uVar26._0_2_ = *(IROpT *)((long)pIVar40 + 4);
              uVar26._2_2_ = *(IRRef1 *)((long)pIVar40 + 6);
              RVar25 = -(uint)((0x605fd9U >> (uVar26 & 0x1f) & 1) != 0) & 0x80200 | RVar25;
              xVar38 = XO_MOVto;
            }
LAB_00136f23:
            pcStack_530 = (code *)0x136f30;
            emit_rmro((ASMState *)local_508,xVar38,RVar25,2,iVar43);
            IVar36 = local_528;
          }
          else {
            pbVar39 = (byte *)(local_508._128_8_ + -4);
            pbVar39[0] = 0xff;
            pbVar39[1] = 0x7f;
            pbVar39[2] = 0xfe;
            pbVar39[3] = 0xff;
            if (uVar57 < 0x8c) {
              *(byte *)(local_508._128_8_ + -5) = (byte)(uVar57 - 0xc);
              pbVar39 = (byte *)(local_508._128_8_ + -5);
              bVar59 = 0x42;
            }
            else {
              *(uint *)(local_508._128_8_ + -8) = uVar57 - 0xc;
              pbVar39 = (byte *)(local_508._128_8_ + -8);
              bVar59 = 0x82;
            }
            pbVar39[-1] = bVar59;
            local_508._128_8_ = pbVar39 + -2;
            pbVar39[-2] = 199;
            if (0x7fff < uVar48) {
              cVar3 = *(char *)(local_508._144_8_ + (ulong)uVar48 * 8 + 6);
              RVar25 = (Reg)cVar3;
              if (cVar3 < '\0') {
                pcStack_530 = (code *)0x136f07;
                RVar25 = ra_allocref((ASMState *)local_508,uVar48,0xbfeb);
              }
              bVar56 = (byte)RVar25 & 0x1f;
              uStack_458 = uStack_458 & (-2 << bVar56 | 0xfffffffeU >> 0x20 - bVar56);
              xVar38 = XO_MOVto;
              goto LAB_00136f23;
            }
            *(IRRef2 *)(pbVar39 + -6) = (pIVar40->field_1).op12;
            if (iVar43 == 0) {
              pbVar39 = pbVar39 + -6;
              bVar56 = 2;
            }
            else if (uVar26 < 0x12000000) {
              pbVar39[-7] = bVar56;
              pbVar39 = pbVar39 + -7;
              bVar56 = 0x42;
            }
            else {
              *(int *)(pbVar39 + -10) = iVar43;
              pbVar39 = pbVar39 + -10;
              bVar56 = 0x82;
            }
            pbVar39[-1] = bVar56;
            pbVar39[-2] = 199;
            local_508._128_8_ = pbVar39 + -2;
LAB_00137108:
          }
          if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_0013b6a3;
        }
        IVar45.field_0 = IVar45.field_0 + 1;
      } while (IVar36 != IVar45);
    }
    if ((char)local_520 == '\x01' && local_3f0 == (GCtrace *)0x0) {
      pcStack_530 = (code *)0x13716f;
      asm_stack_check((ASMState *)local_508,(BCReg)local_404,(IRIns *)0x0,local_508._168_4_ & 0xbfef
                      ,(ExitNo)local_518);
    }
  }
switchD_00137213_caseD_c:
  do {
    local_440 = local_440 - 1;
    if (local_440 <= local_43c) goto LAB_0013abf0;
    pIVar40 = (IRIns *)(local_508._144_8_ + (ulong)local_440 * 8);
    pcStack_530 = (code *)0x1371a4;
    asm_snap_prev((ASMState *)local_508);
  } while (((((char)(pIVar40->field_1).r < '\0') && ((pIVar40->field_1).s == '\0')) &&
           ((((pIVar40->field_1).t.irt | 0x60) & lj_ir_mode[(pIVar40->field_1).o]) < 0x60)) &&
          ((local_450 & 0x40000) != 0));
  if ((char)(pIVar40->field_1).t.irt < '\0') {
    pcStack_530 = (code *)0x1371e1;
    asm_snap_prep((ASMState *)local_508);
  }
  uVar12 = local_508._144_8_;
  if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_0013b6a3;
  switch((pIVar40->field_1).o) {
  case '\0':
  case '\x01':
  case '\x02':
  case '\x03':
  case '\x04':
  case '\x05':
  case '\x06':
  case '\a':
  case '\n':
    goto switchD_00137213_caseD_0;
  case '\b':
  case '\t':
    if ((*(char *)((long)pIVar40 + -3) == ':') && (local_440 - 1 == (uint)(pIVar40->field_0).op1)) {
      pcStack_530 = (code *)0x137402;
      local_440 = (uint)(pIVar40->field_0).op1;
      asm_href((ASMState *)local_508,pIVar40 + -1,(uint)(pIVar40->field_1).o);
    }
    else {
switchD_00137213_caseD_0:
      pcStack_530 = (code *)0x137222;
      asm_comp((ASMState *)local_508,pIVar40);
    }
    goto switchD_00137213_caseD_c;
  case '\v':
    RVar25 = (Reg)*(char *)(local_508._144_8_ + 0x40006);
    if (*(char *)(local_508._144_8_ + 0x40006) < '\0') {
      pcStack_530 = (code *)0x137ec2;
      RVar25 = ra_allocref((ASMState *)local_508,0x8000,0xbfef);
    }
    bVar56 = (byte)RVar25 & 0x1f;
    uStack_458 = uStack_458 & (-2 << bVar56 | 0xfffffffeU >> 0x20 - bVar56);
    pcStack_530 = (code *)0x137eec;
    RVar19 = ra_scratch((ASMState *)local_508,~(1 << (RVar25 & 0x1f)) & 0xbfef);
    local_528 = *(IRIns *)(local_508._144_8_ + ((ulong)(pIVar40->field_0).op2 + 1) * 8);
    bVar56 = *(byte *)((long)local_528 + -3);
    BVar49 = (BCReg)local_404 - (bVar56 + 2);
    BVar32 = 0;
    if (0 < (int)BVar49) {
      BVar32 = BVar49;
    }
    local_404._0_4_ = BVar32;
    *(byte *)(local_508._144_8_ + 0x40004) = *(byte *)(local_508._144_8_ + 0x40004) | 0x20;
    pcStack_530 = (code *)0x137f52;
    emit_rma((ASMState *)local_508,XO_MOVto,RVar25 | 0x80200,
             &((jit_State *)(local_508._152_8_ + -0xc28))->penalty[0x3a].val);
    pcStack_530 = (code *)0x137f6b;
    emit_gri((ASMState *)local_508,0x838100,RVar25 | 0x80200,-((uint)bVar56 * 8 + 0x10));
    pcStack_530 = (code *)0x137f78;
    asm_guardcc((ASMState *)local_508,5);
    pcStack_530 = (code *)0x137f94;
    emit_rmro((ASMState *)local_508,XO_CMP,RVar19 | 0x80200,RVar25,-8);
    pcStack_530 = (code *)0x137fa2;
    emit_loadu64((ASMState *)local_508,RVar19,(uint64_t)local_528);
  case '\f':
  case 'Z':
  case 'd':
    goto switchD_00137213_caseD_c;
  default:
    ((TValue *)(local_508._152_8_ + 0xc10))->n = (double)(pIVar40->field_1).o;
    pcStack_530 = (code *)0x13b8c7;
    lj_trace_err_info((jit_State *)local_508._152_8_,LJ_TRERR_NYIIR);
  case '\x0f':
    iVar43 = local_404._4_4_;
    for (pIVar22 = (IRIns *)(local_508._144_8_ + (ulong)(local_43c + 1) * 8); pIVar22 < pIVar40;
        pIVar22 = pIVar22 + 1) {
      if (((byte)((pIVar22->field_1).o + 0xaf) < 4) &&
         ((-1 < (char)(pIVar22->field_1).r || ((pIVar22->field_1).s != '\0')))) {
        iVar43 = iVar43 + 1;
        local_404._4_4_ = iVar43;
      }
    }
    if (iVar43 != 0) {
      pcStack_530 = (code *)0x137ffc;
      asm_gc_check((ASMState *)local_508);
    }
    local_404._4_4_ = -0x80000000;
    goto switchD_00137213_caseD_c;
  case '\x10':
    if (*(char *)((long)pIVar40 + -2) < '\0') {
      bVar61 = *(char *)((long)pIVar40 + -1) == '\0';
    }
    else {
      bVar61 = false;
    }
    if ((char)(pIVar40->field_1).r < '\0') {
      bVar60 = (local_450 & 0x40000) == 0;
      if ((!bVar60) && ((pIVar40->field_1).s == '\0')) goto switchD_00137213_caseD_c;
    }
    else {
      bVar60 = (local_450 & 0x40000) == 0;
    }
    uVar44 = *(byte *)((long)pIVar40 + -3) - 0x5f;
    if (((uVar44 < 5) && (uVar44 != 1)) && ((bool)((bVar60 ^ 1U) & bVar61))) {
      pcStack_530 = (code *)0x139496;
      ra_allocref((ASMState *)local_508,(uint)(pIVar40->field_0).op1,1);
    }
    goto switchD_00137213_caseD_c;
  case '\x11':
    local_428 = local_42c;
    if (local_404._4_4_ != 0) {
      pcStack_530 = (code *)0x13827f;
      asm_gc_check((ASMState *)local_508);
    }
    local_40c = 0;
    local_3c8 = (undefined1  [16])0x0;
    if (local_410 != 0xffffffff) {
      local_410 = 0;
    }
    uVar44 = 0;
    if (uStack_454 != 0) {
      uVar34 = 0;
      uVar26 = uStack_454;
      do {
        do {
          uVar48 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
            }
          }
          bVar56 = *(byte *)(local_508._144_8_ +
                            (ulong)*(ushort *)(local_3b0 + (ulong)uVar48 * 2) * 8 + 6);
          if (uVar48 == bVar56) {
            uVar57 = 1 << ((byte)uVar48 & 0x1f);
          }
          else {
            uVar57 = 1 << ((byte)uVar48 & 0x1f);
            if (((uint)local_508._168_4_ >> (uVar48 & 0x1f) & 1) == 0) {
              if ((*(byte *)(local_508._144_8_ +
                            (ulong)*(ushort *)(local_508 + (ulong)uVar48 * 4) * 8 + 4) & 0x20) != 0)
              {
                uVar44 = uVar44 | uVar57;
                uVar48 = 0;
                if (-1 < (char)bVar56) {
                  uVar48 = 1 << (bVar56 & 0x1f);
                }
                uVar34 = uVar34 | uVar48;
                goto LAB_0013838d;
              }
              local_528.field_1.op12 = uVar34;
              pcStack_530 = (code *)0x138329;
              ra_restore((ASMState *)local_508,(uint)*(ushort *)(local_508 + (ulong)uVar48 * 4));
              uVar34 = local_528._0_4_;
              if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_0013b6a3;
            }
            if (-1 < (char)bVar56) {
              local_528.field_1.op12 = uVar34;
              pcStack_530 = (code *)0x13835d;
              ra_rename((ASMState *)local_508,(uint)bVar56,uVar48);
              uVar34 = local_528._0_4_;
              if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_0013b6a3;
            }
          }
LAB_0013838d:
          uVar26 = uVar26 & ~uVar57;
        } while (uVar26 != 0);
        if (uVar44 == 0) {
          uVar44 = uStack_454;
          break;
        }
        if ((local_508._168_4_ & uVar44) == 0) {
          pcStack_530 = (code *)0x1383c0;
          asm_phi_break((ASMState *)local_508,uVar44,uVar34,0xbfef);
          pcStack_530 = (code *)0x1383d2;
          asm_phi_break((ASMState *)local_508,uVar44,uVar34,0xffff0000);
          if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_0013b6a3;
        }
        uVar44 = 0;
        uVar34 = 0;
        uVar26 = uStack_454;
      } while (uStack_454 != 0);
    }
    uVar44 = ~(uVar44 | local_508._168_4_) & RStack_45c & 0xffff0000;
    while (uVar44 != 0) {
      uVar26 = 0;
      if (uVar44 != 0) {
        for (; (uVar44 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
        }
      }
      pcStack_530 = (code *)0x139513;
      ra_restore((ASMState *)local_508,(uint)*(ushort *)(local_508 + (ulong)uVar26 * 4));
      uVar44 = uVar44 & ~(1 << (uVar26 & 0x1f));
      if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_0013b6a3;
    }
    uVar44 = ~(uStack_454 | local_508._168_4_) & RStack_45c;
    while (uVar44 != 0) {
      uVar26 = 0;
      if (uVar44 != 0) {
        for (; (uVar44 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
        }
      }
      pcStack_530 = (code *)0x13955e;
      ra_restore((ASMState *)local_508,(uint)*(ushort *)(local_508 + (ulong)uVar26 * 4));
      uVar44 = uVar44 & ~(1 << (uVar26 & 0x1f));
      if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_0013b6a3;
    }
    pbVar39 = (byte *)local_508._128_8_;
    for (uVar44 = uStack_454; local_508._128_8_ = pbVar39, uVar44 != 0;
        uVar44 = uVar44 & (-2 << bVar56 | 0xfffffffeU >> 0x20 - bVar56)) {
      uVar48 = uVar44 >> 0x18 | (uVar44 & 0xff0000) >> 8 | (uVar44 & 0xff00) << 8 | uVar44 << 0x18;
      uVar26 = 0x1f;
      if (uVar48 != 0) {
        for (; uVar48 >> uVar26 == 0; uVar26 = uVar26 - 1) {
        }
      }
      uVar26 = uVar26 ^ 0x18;
      uVar16 = *(ushort *)(local_3b0 + (ulong)uVar26 * 2);
      uVar35 = (ulong)uVar16;
      if (*(char *)(local_508._144_8_ + uVar35 * 8 + 7) != '\0') {
        pIVar40 = (IRIns *)(local_508._144_8_ + uVar35 * 8);
        (pIVar40->field_1).t.irt = (pIVar40->field_1).t.irt & 0xdf;
        bVar56 = *(byte *)(local_508._144_8_ + uVar35 * 8 + 6);
        if ((char)bVar56 < '\0') {
          pcStack_530 = (code *)0x1395d4;
          RVar25 = ra_allocref((ASMState *)local_508,(uint)uVar16,1 << ((byte)uVar26 & 0x1f));
          bVar56 = (byte)RVar25;
        }
        uStack_458 = uStack_458 & (-2 << (bVar56 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar56 & 0x1f));
        pcStack_530 = (code *)0x139604;
        emit_storeofs((ASMState *)local_508,pIVar40,uVar26,4,(uint)(pIVar40->field_1).s << 2);
        if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_0013b6a3;
      }
      bVar56 = (byte)uVar26 & 0x1f;
      pbVar39 = (byte *)local_508._128_8_;
    }
    uVar35 = (ulong)(local_438 - 1);
    if (*(char *)(local_508._144_8_ + uVar35 * 8 + 5) == '\x13') {
      pIVar40 = (IRIns *)(local_508._144_8_ + uVar35 * 8);
      bVar56 = 0;
      bVar61 = false;
      do {
        if (((pIVar40->field_1).s != '\0') &&
           (*(char *)(local_508._144_8_ + (ulong)(pIVar40->field_0).op1 * 8 + 7) != '\0')) {
          bVar60 = (byte)(((pIVar40->field_1).t.irt & 0x1f) - 0xd) < 2;
          bVar56 = bVar56 | bVar60 + 1U;
          bVar61 = (bool)(bVar61 | !bVar60);
        }
        pcVar1 = (char *)((long)pIVar40 + -3);
        pIVar40 = pIVar40 + -1;
      } while (*pcVar1 == '\x13');
      if (bVar61) {
        if ((unique0x100022c8 & (undefined1  [16])0xbfef) == (undefined1  [16])0x0) {
          uVar42 = 0;
          uVar44 = -(uint)((0x605fd9U >>
                            (*(uint *)(local_508._144_8_ + (ulong)(ushort)local_508._0_2_ * 8 + 4) &
                            0x1f) & 1) != 0) & 0x80200;
          pbVar39[-1] = 0x24;
          pbVar39[-3] = 0x8b;
          pbVar39[-2] = 4;
          if ((short)uVar44 == 0) {
            local_508._128_8_ = pbVar39 + -3;
          }
          else {
            local_508._128_8_ = pbVar39 + -4;
            pbVar39[-4] = (byte)(uVar44 >> 0x10) | 0x40;
          }
          uVar35 = (ulong)(local_438 - 1);
          if (*(char *)(local_508._144_8_ + uVar35 * 8 + 5) == '\x13') goto LAB_0013a47f;
        }
        else {
          uVar44 = 0;
          if ((unique0x100022c8 & (undefined1  [16])0xbfef) != (undefined1  [16])0x0) {
            for (; ((local_508._168_4_ & 0xbfef) >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
            }
          }
          uVar42 = (ulong)uVar44;
LAB_0013a47f:
          pIVar40 = (IRIns *)(local_508._144_8_ + uVar35 * 8);
          do {
            if ((pIVar40->field_1).s != '\0') {
              bVar59 = *(byte *)(local_508._144_8_ + (ulong)(pIVar40->field_0).op1 * 8 + 7);
              if ((bVar59 != 0) && (1 < (byte)(((pIVar40->field_1).t.irt & 0x1f) - 0xd))) {
                pcStack_530 = (code *)0x13a4cc;
                emit_storeofs((ASMState *)local_508,
                              (IRIns *)(local_508._144_8_ + (ulong)(pIVar40->field_0).op1 * 8),
                              (Reg)uVar42,4,(uint)bVar59 << 2);
                pcStack_530 = (code *)0x13a4e7;
                emit_loadofs((ASMState *)local_508,pIVar40,(Reg)uVar42,4,
                             (uint)(pIVar40->field_1).s << 2);
                if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_0013b6a3;
              }
            }
            pcVar1 = (char *)((long)pIVar40 + -3);
            pIVar40 = pIVar40 + -1;
          } while (*pcVar1 == '\x13');
        }
        if (((uint)local_508._168_4_ >> ((uint)uVar42 & 0x1f) & 1) == 0) {
          pcStack_530 = (code *)0x13a53b;
          emit_storeofs((ASMState *)local_508,
                        (IRIns *)(local_508._144_8_ + (ulong)*(ushort *)(local_508 + uVar42 * 4) * 8
                                 ),(uint)uVar42,4,0);
        }
      }
      if ((bVar56 & 2) != 0) {
        uVar44 = 0;
        bVar61 = (stack0xfffffffffffffba0 & (undefined1  [16])0xffff0000) != (undefined1  [16])0x0;
        if (bVar61) {
          for (; ((local_508._168_4_ & 0xffff0000) >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
          }
        }
        uVar35 = 0x10;
        if (bVar61) {
          uVar35 = (ulong)uVar44;
        }
        uVar44 = (uint)uVar35;
        if (((uint)local_508._168_4_ >> (uVar44 & 0x1f) & 1) == 0) {
          pcStack_530 = (code *)0x13a597;
          emit_loadofs((ASMState *)local_508,
                       (IRIns *)(local_508._144_8_ + (ulong)*(ushort *)(local_508 + uVar35 * 4) * 8)
                       ,uVar44,4,0);
        }
        if (*(char *)(local_508._144_8_ + (ulong)(local_438 - 1) * 8 + 5) == '\x13') {
          pIVar40 = (IRIns *)(local_508._144_8_ + (ulong)(local_438 - 1) * 8);
          do {
            if ((pIVar40->field_1).s != '\0') {
              bVar56 = *(byte *)(local_508._144_8_ + (ulong)(pIVar40->field_0).op1 * 8 + 7);
              if ((bVar56 != 0) && ((byte)(((pIVar40->field_1).t.irt & 0x1f) - 0xd) < 2)) {
                pcStack_530 = (code *)0x13a5ff;
                emit_storeofs((ASMState *)local_508,
                              (IRIns *)(local_508._144_8_ + (ulong)(pIVar40->field_0).op1 * 8),
                              uVar44,4,(uint)bVar56 << 2);
                pcStack_530 = (code *)0x13a61a;
                emit_loadofs((ASMState *)local_508,pIVar40,uVar44,4,(uint)(pIVar40->field_1).s << 2)
                ;
                if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_0013b6a3;
              }
            }
            pcVar1 = (char *)((long)pIVar40 + -3);
            pIVar40 = pIVar40 + -1;
          } while (*pcVar1 == '\x13');
        }
        if ((local_508._168_4_ & 1 << ((byte)uVar35 & 0x1f)) == 0) {
          pcStack_530 = (code *)0x13a66b;
          emit_storeofs((ASMState *)local_508,
                        (IRIns *)(local_508._144_8_ + (ulong)*(ushort *)(local_508 + uVar35 * 4) * 8
                                 ),uVar44,4,0);
        }
      }
    }
    iVar43 = (int)local_508._128_8_;
    if (local_3b8 == (byte *)0x0) {
      local_3e0[-5] = 0xe9;
      if (local_44c == 0) {
        iVar18 = iVar43 - (int)local_3e0;
        lVar28 = 3;
        lVar53 = -4;
        pbVar37 = local_3e0;
LAB_0013a713:
        *(int *)(local_3e0 + lVar53) = iVar18;
        pbVar23 = (byte *)(local_508._128_8_ + lVar28);
      }
      else {
        pbVar37 = local_3e0 + -5;
        iVar18 = iVar43 - (int)pbVar37;
        *(int *)(local_3e0 + -9) = iVar18;
        if (local_44c == 2) {
          iVar18 = iVar18 + 6;
          lVar28 = 8;
          lVar53 = -0xf;
          goto LAB_0013a713;
        }
        pbVar23 = (byte *)(local_508._128_8_ + 4);
      }
      if (pbVar37 + -0x80 <= pbVar23) {
        local_3b8 = pbVar23;
        local_440 = local_43c;
        local_3f8->nins = local_438;
      }
    }
    else {
      local_3b8 = (byte *)0x0;
      if (local_44c == 0) {
        local_3e0[-1] = (char)local_508._128_8_ - (char)local_3e0;
        local_3e0[-2] = 0xeb;
      }
      else {
        local_3e0[-5] = 0xe9;
        bVar56 = (char)local_508._128_8_ - ((char)local_3e0 + -5);
        local_3e0[-6] = bVar56;
        if (local_44c == 2) {
          local_3e0[-8] = bVar56 + 2;
        }
      }
    }
    local_3d0 = (byte *)local_508._128_8_;
    if ((byte *)local_508._128_8_ != pbVar39) {
      *(int *)(local_508._128_8_ + -4) = (int)pbVar39 - iVar43;
      *(byte *)(local_508._128_8_ + -5) = 0xe9;
      local_508._128_8_ = local_508._128_8_ + -5;
      goto LAB_0013a779;
    }
    goto switchD_00137213_caseD_c;
  case '\x12':
    bVar56 = *(byte *)(local_508._144_8_ + (ulong)(pIVar40->field_0).op1 * 8 + 6);
    if ((char)bVar56 < '\0') {
      RVar58 = 0xbfef;
      if ((byte)(((pIVar40->field_1).t.irt & 0x1f) - 0xd) < 2) {
        RVar58 = 0xffff0000;
      }
      pcStack_530 = (code *)0x137e3a;
      RVar25 = ra_allocref((ASMState *)local_508,(uint)(pIVar40->field_0).op1,RVar58);
      bVar56 = (byte)RVar25;
    }
    uStack_458 = uStack_458 & (-2 << (bVar56 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar56 & 0x1f));
    goto switchD_00137213_caseD_c;
  case '\x13':
    uVar44 = 0xbfef;
    if ((byte)(((pIVar40->field_1).t.irt & 0x1f) - 0xd) < 2) {
      uVar44 = 0xffff0000;
    }
    if ((pIVar40->field_1).r != 0xfe) {
      uVar35 = (ulong)(pIVar40->field_0).op1;
      if (*(char *)(local_508._144_8_ + uVar35 * 8 + 7) == '\0') {
        pIVar22 = (IRIns *)(local_508._144_8_ + (ulong)(pIVar40->field_0).op2 * 8);
        if ((pIVar22->field_1).s == '\0') {
          uVar44 = uVar44 & ~uStack_454;
          if ((local_508._168_4_ & uVar44 & (local_508._168_4_ & uVar44) - 1) != 0) {
            if ((char)(pIVar22->field_1).r < '\0') {
              pcStack_530 = (code *)0x13a193;
              RVar25 = ra_allocref((ASMState *)local_508,(uint)(pIVar40->field_0).op2,uVar44);
            }
            else {
              pcStack_530 = (code *)0x139b3f;
              RVar25 = ra_scratch((ASMState *)local_508,uVar44);
              pcStack_530 = (code *)0x139b53;
              emit_movrr((ASMState *)local_508,pIVar22,RVar25,(uint)(pIVar22->field_1).r);
            }
            bVar56 = (byte)RVar25;
            (pIVar40->field_1).r = bVar56;
            uStack_454 = uStack_454 | 1 << (bVar56 & 0x1f);
            *(IRRef1 *)(local_3b0 + (ulong)RVar25 * 2) = (pIVar40->field_0).op1;
            pbVar39 = (byte *)(uVar12 + uVar35 * 8 + 4);
            *pbVar39 = *pbVar39 | 0x20;
            if (*(char *)(uVar12 + uVar35 * 8 + 6) < '\0') {
              *(byte *)(uVar12 + uVar35 * 8 + 6) = bVar56 | 0x80;
            }
            goto switchD_00137213_caseD_c;
          }
          if ((*(char *)(local_508._144_8_ + uVar35 * 8 + 6) < '\0') &&
             ((char)(pIVar22->field_1).r < '\0')) {
            pcStack_530 = (code *)0x138194;
            ra_spill((ASMState *)local_508,pIVar40);
            (pIVar22->field_1).s = (pIVar40->field_1).s;
            goto switchD_00137213_caseD_c;
          }
        }
      }
      pcStack_530 = (code *)0x13b8a3;
      lj_trace_err((jit_State *)local_508._152_8_,LJ_TRERR_NYIPHI);
    }
    goto switchD_00137213_caseD_c;
  case '\x15':
    pcStack_530 = (code *)0x138564;
    asm_guardcc((ASMState *)local_508,5);
    *(byte *)(local_508._128_8_ + -1) = 0x80;
    addr = (void *)((long)&((jit_State *)(local_508._152_8_ + -0xc28))->penalty[0x2c].pc.ptr64 + 1);
    xVar38 = XO_GROUP3b;
    RVar25 = 0;
    local_508._128_8_ = (byte *)(local_508._128_8_ + -1);
    goto LAB_00138592;
  case '\x1f':
    pcStack_530 = (code *)0x138102;
    asm_neg_not((ASMState *)local_508,pIVar40,XOg_NOT);
    goto switchD_00137213_caseD_c;
  case ' ':
    pcStack_530 = (code *)0x137dad;
    RVar25 = ra_dest((ASMState *)local_508,pIVar40,0xbfef);
    uVar44._0_2_ = *(IROpT *)((long)pIVar40 + 4);
    uVar44._2_2_ = *(IRRef1 *)((long)pIVar40 + 6);
    uVar44 = -(uint)((0x605fd9U >> (uVar44 & 0x1f) & 1) != 0) & 0x80200;
    *(Reg *)(local_508._128_8_ + -4) = (RVar25 & 7) << 0x18 | 0xc80f00fd;
    uVar26 = RVar25 >> 3 & 1;
    if ((uVar44 >> 1 & 0xffff) == 0 && uVar26 == 0) {
      local_508._128_8_ = local_508._128_8_ + -2;
    }
    else {
      *(byte *)(local_508._128_8_ + -3) = (byte)(uVar44 >> 0x10) | (byte)uVar26 | 0x40;
      local_508._128_8_ = local_508._128_8_ + -3;
    }
    pcStack_530 = (code *)0x1394cf;
    ra_left((ASMState *)local_508,RVar25,(uint)(pIVar40->field_0).op1);
    goto switchD_00137213_caseD_c;
  case '!':
    pcStack_530 = (code *)0x137e94;
    asm_intarith((ASMState *)local_508,pIVar40,XOg_AND);
    goto switchD_00137213_caseD_c;
  case '\"':
    pcStack_530 = (code *)0x138449;
    asm_intarith((ASMState *)local_508,pIVar40,XOg_OR);
    goto switchD_00137213_caseD_c;
  case '#':
    pcStack_530 = (code *)0x137d82;
    asm_intarith((ASMState *)local_508,pIVar40,XOg_XOR);
    goto switchD_00137213_caseD_c;
  case '$':
    pcStack_530 = (code *)0x1381da;
    asm_bitshift((ASMState *)local_508,pIVar40,XOg_SHL,XV_SHLX);
    goto switchD_00137213_caseD_c;
  case '%':
    pcStack_530 = (code *)0x1380eb;
    asm_bitshift((ASMState *)local_508,pIVar40,XOg_SHR,XV_SHRX);
    goto switchD_00137213_caseD_c;
  case '&':
    pcStack_530 = (code *)0x138432;
    asm_bitshift((ASMState *)local_508,pIVar40,XOg_SAR,XV_SARX);
    goto switchD_00137213_caseD_c;
  case '\'':
    xs = XOg_ROL;
    goto LAB_0013845b;
  case '(':
    xs = XOg_ROR;
LAB_0013845b:
    pcStack_530 = (code *)0x138462;
    asm_bitshift((ASMState *)local_508,pIVar40,xs,XOg_FADDq);
    goto switchD_00137213_caseD_c;
  case ')':
    uVar44 = (pIVar40->field_1).t.irt & 0x1f;
    if (uVar44 != 0xe) {
      if ((local_3c8._8_8_ != local_508._128_8_) && ((0x605fd9U >> uVar44 & 1) == 0)) {
        uVar42 = (ulong)(pIVar40->field_0).op1;
        uVar35 = (ulong)(pIVar40->field_0).op2;
        local_508._164_2_ = 0x8080;
        local_508[0xa6] = '\0';
        local_508._160_4_ = 0;
        cVar3 = *(char *)(local_508._144_8_ + uVar42 * 8 + 6);
        if (cVar3 < '\0') {
          if ((((pIVar40->field_0).op1 != (pIVar40->field_0).op2) &&
              (*(char *)(local_508._144_8_ + uVar42 * 8 + 5) == ')')) &&
             ((local_410 < (pIVar40->field_0).op1 &&
              ((-1 < (short)(pIVar40->field_0).op2 ||
               (-1 < *(short *)(local_508._144_8_ + uVar42 * 8 + 2))))))) {
            cVar3 = *(char *)(local_508._144_8_ +
                             (ulong)(((IRIns *)(local_508._144_8_ + uVar42 * 8))->field_0).op1 * 8 +
                             6);
            uVar44 = (uint)cVar3;
            if (cVar3 < '\0') {
              pcStack_530 = (code *)0x13a90e;
              uVar44 = ra_allocref((ASMState *)local_508,
                                   (uint)(((IRIns *)(local_508._144_8_ + uVar42 * 8))->field_0).op1,
                                   0xbfef);
            }
            uVar26 = uStack_458 & ~(1 << (uVar44 & 0x1f));
            uStack_458 = uVar26;
            uVar48 = ~(1 << (uVar44 & 0x1f)) & 0xbfef;
            local_508[0xa4] = (uint8_t)uVar44;
            if ((short)(pIVar40->field_0).op2 < 0) {
              local_508._160_4_ =
                   (((IRIns *)(local_508._144_8_ + (ulong)*(ushort *)(uVar12 + uVar42 * 8 + 2) * 8))
                   ->field_1).op12;
              uVar16 = (pIVar40->field_0).op2;
            }
            else {
              local_508._160_4_ = (((IRIns *)(uVar12 + uVar35 * 8))->field_1).op12;
              uVar16 = *(ushort *)(uVar12 + uVar42 * 8 + 2);
            }
            cVar3 = *(char *)(local_508._144_8_ + (ulong)uVar16 * 8 + 6);
            uVar44 = (uint)cVar3;
            if (cVar3 < '\0') {
              pcStack_530 = (code *)0x13abb4;
              uVar44 = ra_allocref((ASMState *)local_508,(uint)uVar16,uVar48);
              uVar26 = uStack_458;
            }
            uStack_458 = uVar26 & ~(1 << (uVar44 & 0x1f));
            RVar58 = uVar48 & ~(1 << (uVar44 & 0x1f));
            local_508[0xa5] = (char)uVar44;
            goto LAB_0013abcf;
          }
        }
        else {
          RVar58 = ~(1 << ((int)cVar3 & 0x1fU)) & 0xbfef;
          uStack_458 = uStack_458 & ~(1 << ((int)cVar3 & 0x1fU));
          local_508[0xa4] = *(undefined1 *)(local_508._144_8_ + uVar42 * 8 + 6);
          local_508[0xa5] = 0x80;
          uVar16 = (pIVar40->field_0).op2;
          if (((short)uVar16 < 0) && (*(char *)(local_508._144_8_ + uVar35 * 8 + 6) < '\0')) {
            if (((*(char *)(local_508._144_8_ + uVar35 * 8 + 5) == ')') && (local_410 < uVar16)) &&
               (-1 < *(short *)(local_508._144_8_ + uVar35 * 8 + 2))) {
              pcStack_530 = (code *)0x13ab5a;
              RVar25 = ra_alloc1((ASMState *)local_508,
                                 (uint)(((IRIns *)(local_508._144_8_ + uVar35 * 8))->field_0).op1,
                                 RVar58);
              RVar58 = RVar58 & ~(1 << (RVar25 & 0x1f));
              local_508[0xa5] = (char)RVar25;
              local_508._160_4_ =
                   (((IRIns *)(local_508._144_8_ + (ulong)*(ushort *)(uVar12 + uVar35 * 8 + 2) * 8))
                   ->field_1).op12;
LAB_0013abcf:
              pcStack_530 = (code *)0x13abe1;
              uVar44 = ra_dest((ASMState *)local_508,pIVar40,RVar58);
              xVar38 = XO_LEA;
              break;
            }
          }
          else {
            bVar56 = (pIVar40->field_1).r;
            if (((long)(char)bVar56 < 0) ||
               ((((*(byte *)(local_508._144_8_ + uVar42 * 8 + 4) & 0x40) == 0 ||
                 (*(IRRef1 *)(local_3b0 + (long)(char)bVar56 * 2) != (pIVar40->field_0).op1)) &&
                (((*(byte *)(local_508._144_8_ + uVar35 * 8 + 4) & 0x40) == 0 ||
                 (*(ushort *)(local_3b0 + (ulong)bVar56 * 2) != uVar16)))))) {
              if ((short)uVar16 < 0) {
                uVar44 = (uint)*(byte *)(local_508._144_8_ + uVar35 * 8 + 6);
                RVar58 = RVar58 & ~(1 << (uVar44 & 0x1f));
                uStack_458 = uStack_458 & ~(1 << (uVar44 & 0x1f));
                local_508[0xa5] = *(undefined1 *)(local_508._144_8_ + uVar35 * 8 + 6);
              }
              else {
                local_508._160_4_ = (((IRIns *)(local_508._144_8_ + uVar35 * 8))->field_1).op12;
              }
              goto LAB_0013abcf;
            }
          }
        }
      }
      goto switchD_00137213_caseD_35;
    }
    pcStack_530 = (code *)0x1384df;
    asm_fparith((ASMState *)local_508,pIVar40,XO_ADDSD);
    goto switchD_00137213_caseD_c;
  case '*':
    if (((pIVar40->field_1).t.irt & 0x1f) != 0xe) goto switchD_00137213_caseD_36;
    pcStack_530 = (code *)0x138536;
    asm_fparith((ASMState *)local_508,pIVar40,XO_SUBSD);
    goto switchD_00137213_caseD_c;
  case '+':
    if (((pIVar40->field_1).t.irt & 0x1f) != 0xe) goto switchD_00137213_caseD_37;
    pcStack_530 = (code *)0x1384ff;
    asm_fparith((ASMState *)local_508,pIVar40,XO_MULSD);
    goto switchD_00137213_caseD_c;
  case ',':
    bVar56 = (pIVar40->field_1).t.irt & 0x1f;
    if (bVar56 != 0xe) {
      id_00 = (bVar56 != 0x15) + IRCALL_lj_carith_divi64;
      goto LAB_00138eb7;
    }
    pcStack_530 = (code *)0x1384b8;
    asm_fparith((ASMState *)local_508,pIVar40,XO_DIVSD);
    goto switchD_00137213_caseD_c;
  case '-':
    bVar56 = (pIVar40->field_1).t.irt & 0x1f;
    if (bVar56 == 0x13) {
      local_138.u64._4_2_ = (pIVar40->field_0).op2;
      local_138.u64._0_2_ = (pIVar40->field_0).op1;
      pCVar41 = lj_ir_callinfo + 0x2c;
LAB_001386a7:
      local_138.u64._6_2_ = 0;
      local_138.u64._2_2_ = 0;
      pcStack_530 = (code *)0x1386ba;
      asm_setupresult((ASMState *)local_508,pIVar40,pCVar41);
      goto LAB_001386c0;
    }
    id_00 = (bVar56 != 0x15) + IRCALL_lj_carith_modi64;
    goto LAB_00138eb7;
  case '.':
    bVar56 = (pIVar40->field_1).t.irt & 0x1f;
    if (bVar56 == 0xe) {
      local_138.u64._4_2_ = (pIVar40->field_0).op2;
      local_138.u64._0_2_ = (pIVar40->field_0).op1;
      pCVar41 = lj_ir_callinfo + 0x41;
      goto LAB_001386a7;
    }
    id_00 = (bVar56 != 0x15) + IRCALL_lj_carith_powi64;
    goto LAB_00138eb7;
  case '/':
    if (((pIVar40->field_1).t.irt & 0x1f) == 0xe) {
      pcStack_530 = (code *)0x138729;
      asm_fparith((ASMState *)local_508,pIVar40,XO_XORPS);
    }
    else {
      pcStack_530 = (code *)0x138f70;
      asm_neg_not((ASMState *)local_508,pIVar40,XOg_NEG);
    }
    goto switchD_00137213_caseD_c;
  case '0':
    pcStack_530 = (code *)0x138416;
    asm_fparith((ASMState *)local_508,pIVar40,XO_ANDPS);
    goto switchD_00137213_caseD_c;
  case '1':
    bVar56 = (pIVar40->field_1).s;
    iVar43 = (uint)bVar56 * 4;
    bVar59 = (pIVar40->field_1).r;
    if (-1 < (char)bVar59) {
      iVar18 = 1 << (bVar59 & 0x1f);
      stack0xfffffffffffffba0 = CONCAT44(iVar18,iVar18) | stack0xfffffffffffffba0;
      pcStack_530 = (code *)0x138236;
      emit_rmro((ASMState *)local_508,XO_MOVSD,(int)(char)bVar59,4,iVar43);
    }
    if (bVar56 == 0) {
      bVar56 = 0x1c;
    }
    else if (bVar56 < 0x20) {
      *(byte *)(local_508._128_8_ + -1) = (byte)iVar43;
      local_508._128_8_ = local_508._128_8_ + -1;
      bVar56 = 0x5c;
    }
    else {
      *(int *)(local_508._128_8_ + -4) = iVar43;
      local_508._128_8_ = local_508._128_8_ + -4;
      bVar56 = 0x9c;
    }
    *(byte *)(local_508._128_8_ + -1) = 0x24;
    *(byte *)(local_508._128_8_ + -2) = bVar56;
    *(byte *)(local_508._128_8_ + -3) = 0xdd;
    *(byte *)(local_508._128_8_ + -7) = 0xd9;
    *(byte *)(local_508._128_8_ + -6) = 0xfd;
    *(byte *)(local_508._128_8_ + -5) = 0xdd;
    *(byte *)(local_508._128_8_ + -4) = 0xd9;
    local_508._128_8_ = local_508._128_8_ + -7;
    pcStack_530 = (code *)0x139794;
    asm_x87load((ASMState *)local_508,(uint)(pIVar40->field_0).op1);
    pcStack_530 = (code *)0x1397a0;
    asm_x87load((ASMState *)local_508,(uint)(pIVar40->field_0).op2);
    goto switchD_00137213_caseD_c;
  case '2':
    if (((pIVar40->field_1).t.irt & 0x1f) == 0xe) {
      pcStack_530 = (code *)0x137e6e;
      asm_fparith((ASMState *)local_508,pIVar40,XO_MINSD);
    }
    else {
      pcStack_530 = (code *)0x138d07;
      asm_intmin_max((ASMState *)local_508,pIVar40,0xf);
    }
    goto switchD_00137213_caseD_c;
  case '3':
    if (((pIVar40->field_1).t.irt & 0x1f) == 0xe) {
      pcStack_530 = (code *)0x1381be;
      asm_fparith((ASMState *)local_508,pIVar40,XO_MAXSD);
    }
    else {
      pcStack_530 = (code *)0x138d16;
      asm_intmin_max((ASMState *)local_508,pIVar40,0xc);
    }
    goto switchD_00137213_caseD_c;
  case '4':
    uVar16 = (pIVar40->field_0).op2;
    if (uVar16 != 3) {
      if (uVar16 < 3) {
        if ((local_450 & 0x20) == 0) {
          bVar56 = (pIVar40->field_1).r & 0x1f;
          RVar58 = (-2 << bVar56 | 0xfffffffeU >> 0x20 - bVar56) & 0xf0001;
          if ((char)(pIVar40->field_1).r < '\0') {
            RVar58 = 0xf0001;
          }
          pcStack_530 = (code *)0x138e5d;
          ra_evictset((ASMState *)local_508,RVar58);
          pcStack_530 = (code *)0x138e6d;
          ra_destreg((ASMState *)local_508,pIVar40,0x10);
          pcVar30 = lj_vm_trunc_sse;
          if (uVar16 == 1) {
            pcVar30 = lj_vm_ceil_sse;
          }
          target = lj_vm_floor_sse;
          if (uVar16 != 0) {
            target = pcVar30;
          }
          pcStack_530 = (code *)0x138e97;
          emit_call_((ASMState *)local_508,(MCode *)target);
          pcStack_530 = (code *)0x138ea8;
          ra_left((ASMState *)local_508,0x10,(uint)(pIVar40->field_0).op1);
        }
        else {
          pcStack_530 = (code *)0x139f98;
          RVar25 = ra_dest((ASMState *)local_508,pIVar40,0xffff0000);
          pcStack_530 = (code *)0x139fac;
          RVar19 = asm_fuseload((ASMState *)local_508,(uint)(pIVar40->field_0).op1,0xffff0000);
          *(byte *)(local_508._128_8_ + -1) = (char)uVar16 + 9;
          pcStack_530 = (code *)0x139fd6;
          local_508._128_8_ = (byte *)(local_508._128_8_ + -1);
          emit_mrm((ASMState *)local_508,XO_ROUNDSD,RVar25,RVar19);
          uVar12 = local_508._128_8_;
          if (*(byte *)(local_508._128_8_ + 1) != 0x3a) {
            *(byte *)local_508._128_8_ = *(byte *)(local_508._128_8_ + 1);
            *(byte *)(local_508._128_8_ + 1) = 0xf;
          }
          local_508._128_8_ = (byte *)(local_508._128_8_ + -1);
          *(byte *)(uVar12 + -1) = 0x66;
        }
      }
      else {
        pcStack_530 = (code *)0x139a72;
        asm_callid((ASMState *)local_508,pIVar40,uVar16 + IRCALL_lj_vm_floor);
      }
      goto switchD_00137213_caseD_c;
    }
    pcStack_530 = (code *)0x13864f;
    RVar25 = ra_dest((ASMState *)local_508,pIVar40,0xffff0000);
    pcStack_530 = (code *)0x138663;
    RVar19 = asm_fuseload((ASMState *)local_508,(uint)(pIVar40->field_0).op1,0xffff0000);
    xVar38 = XO_SQRTSD;
    goto LAB_0013866e;
  case '5':
switchD_00137213_caseD_35:
    pcStack_530 = (code *)0x13a3cf;
    asm_intarith((ASMState *)local_508,pIVar40,XOg_ADD);
    goto switchD_00137213_caseD_c;
  case '6':
switchD_00137213_caseD_36:
    pcStack_530 = (code *)0x13854d;
    asm_intarith((ASMState *)local_508,pIVar40,XOg_SUB);
    goto switchD_00137213_caseD_c;
  case '7':
switchD_00137213_caseD_37:
    pcStack_530 = (code *)0x138516;
    asm_intarith((ASMState *)local_508,pIVar40,XOg_X_IMUL);
    goto switchD_00137213_caseD_c;
  case '8':
    pcStack_530 = (code *)0x137aa9;
    RVar25 = ra_dest((ASMState *)local_508,pIVar40,0xbfef);
    pcStack_530 = (code *)0x137abb;
    asm_fusearef((ASMState *)local_508,pIVar40,0xbfef);
    uVar44 = RVar25 | 0x80200;
    xVar38 = XO_LEA;
    break;
  case '9':
    local_528.gcr.gcptr64._2_6_ = 0;
    local_528.field_0.op1 =
         (((IRIns *)(local_508._144_8_ + (ulong)(pIVar40->field_0).op2 * 8))->field_0).op1;
    uVar16 = *(ushort *)(local_508._144_8_ + (ulong)(pIVar40->field_0).op2 * 8 + 2);
    if (((char)(pIVar40->field_1).r < '\0') && ((pIVar40->field_1).s == '\0')) {
      RVar25 = 0x80;
    }
    else {
      pcStack_530 = (code *)0x13804c;
      RVar25 = ra_dest((ASMState *)local_508,pIVar40,0xbfef);
    }
    uVar44 = (uint)*(char *)(local_508._144_8_ + (ulong)(pIVar40->field_0).op1 * 8 + 6);
    if ((int)uVar44 < 0) {
      pcStack_530 = (code *)0x138072;
      uVar44 = ra_allocref((ASMState *)local_508,(uint)(pIVar40->field_0).op1,0xbfef);
    }
    iVar43 = (uint)uVar16 * 0x18;
    bVar56 = (byte)uVar44;
    uStack_458 = uStack_458 & (-2 << (bVar56 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar56 & 0x1f));
    if (RVar25 < 0x80) {
      if (uVar16 == 0) {
        if (RVar25 != uVar44) {
          *(byte *)(local_508._128_8_ + -1) = (bVar56 & 7) + (char)RVar25 * '\b' | 0xc0;
          *(byte *)(local_508._128_8_ + -2) = 0x8b;
          *(byte *)(local_508._128_8_ + -3) =
               (byte)(uVar44 >> 3) & 1 | (byte)(RVar25 >> 1) & 4 | 0x48;
          local_508._128_8_ = local_508._128_8_ + -3;
        }
      }
      else if (RVar25 == uVar44) {
        pcStack_530 = (code *)0x1380cf;
        emit_gri((ASMState *)local_508,0x838100,RVar25 | 0x80200,iVar43);
      }
      else {
        pcStack_530 = (code *)0x139d1f;
        emit_rmro((ASMState *)local_508,XO_LEA,RVar25 | 0x80200,uVar44,iVar43);
      }
    }
    pcStack_530 = (code *)0x139d2e;
    asm_guardcc((ASMState *)local_508,5);
    IVar36 = local_528;
    bVar59 = *(byte *)(uVar12 + (long)local_528 * 8 + 4) & 0x1f;
    if (bVar59 < 3) {
      *(uint *)(local_508._128_8_ + -4) = (int)(char)~bVar59 << 0xf | 0x7fff;
      local_508._128_8_ = local_508._128_8_ + -4;
      pcStack_530 = (code *)0x139d7b;
      emit_rmro((ASMState *)local_508,XO_ARITHi,7,uVar44,iVar43 + 0xc);
    }
    else {
      pcStack_530 = (code *)0x139d9a;
      RVar25 = ra_scratch((ASMState *)local_508,~(1 << (bVar56 & 0x1f)) & 0xbfef);
      pcStack_530 = (code *)0x139dba;
      emit_rmro((ASMState *)local_508,XO_CMP,RVar25 | 0x80200,uVar44,iVar43 + 8);
      bVar56 = *(byte *)(uVar12 + (long)IVar36 * 8 + 4) & 0x1f;
      if (bVar56 == 0xe) {
        IVar36 = *(IRIns *)(uVar12 + ((long)IVar36 + 1) * 8);
      }
      else {
        IVar36.field_0 = (long)(char)~bVar56 << 0x2f | *(IRIns *)(uVar12 + ((long)IVar36 + 1) * 8);
      }
      pcStack_530 = (code *)0x139de8;
      emit_loadu64((ASMState *)local_508,RVar25,(uint64_t)IVar36);
    }
    goto switchD_00137213_caseD_c;
  case ':':
    pcStack_530 = (code *)0x13873d;
    asm_href((ASMState *)local_508,pIVar40,IR_LT);
    goto switchD_00137213_caseD_c;
  case ';':
    if ((pIVar40->field_1).r != 0xfe) {
      pcStack_530 = (code *)0x1379e4;
      asm_snap_prep((ASMState *)local_508);
      local_138.field_4.i = 0x7fff;
      local_138.u64._4_2_ = (pIVar40->field_0).op1;
      local_138.u64._6_2_ = 0;
      local_130 = 0x7ffd;
      pcStack_530 = (code *)0x137a18;
      asm_setupresult((ASMState *)local_508,pIVar40,lj_ir_callinfo + 0x23);
      pcStack_530 = (code *)0x137a26;
      asm_gencall((ASMState *)local_508,lj_ir_callinfo + 0x23,(IRRef *)&local_138.u64);
      RVar25 = (Reg)*(byte *)(local_508._144_8_ + 0x3ffee);
      iVar43 = 1 << (*(byte *)(local_508._144_8_ + 0x3ffee) & 0x1f);
      stack0xfffffffffffffba0 = CONCAT44(iVar43,iVar43) | stack0xfffffffffffffba0;
      *(undefined1 *)(local_508._144_8_ + 0x3ffee) = 0xff;
      IVar33 = (IRRef)(pIVar40->field_0).op2;
      goto LAB_00139a45;
    }
    goto switchD_00137213_caseD_c;
  case '<':
  case '=':
    pcStack_530 = (code *)0x1372c0;
    RVar25 = ra_dest((ASMState *)local_508,pIVar40,0xbfef);
    bVar56 = (pIVar40->field_1).t.irt & 0x9f;
    if ((long)(short)(pIVar40->field_0).op1 < 0 || bVar56 == 0x89) {
      pcStack_530 = (code *)0x1372f4;
      RVar19 = ra_scratch((ASMState *)local_508,0xbfef);
      if ((pIVar40->field_1).o == '=') {
        xVar38 = XO_LEA;
        iVar52 = 0x10;
      }
      else {
        xVar38 = XO_MOV;
        iVar52 = 0x20;
      }
      pcStack_530 = (code *)0x138c02;
      emit_rmro((ASMState *)local_508,xVar38,RVar25 | 0x80200,RVar19,iVar52);
      if (bVar56 == 0x89) {
        pcStack_530 = (code *)0x138c22;
        asm_guardcc((ASMState *)local_508,(pIVar40->field_1).o == '=' ^ 5);
        *(byte *)(local_508._128_8_ + -1) = 0;
        pcStack_530 = (code *)0x138c52;
        local_508._128_8_ = (byte *)(local_508._128_8_ + -1);
        emit_rmro((ASMState *)local_508,XO_ARITHib,7,RVar19,10);
      }
      uVar16 = (pIVar40->field_0).op1;
      if ((short)uVar16 < 0) {
        cVar3 = *(char *)(local_508._144_8_ + (ulong)uVar16 * 8 + 6);
        RVar25 = (Reg)cVar3;
        if (cVar3 < '\0') {
          pcStack_530 = (code *)0x1391f4;
          RVar25 = ra_allocref((ASMState *)local_508,(uint)uVar16,0xbfef);
        }
        bVar56 = (byte)RVar25 & 0x1f;
        uStack_458 = uStack_458 & (-2 << bVar56 | 0xfffffffeU >> 0x20 - bVar56);
        pcStack_530 = (code *)0x139226;
        emit_rmro((ASMState *)local_508,XO_MOV,RVar19 | 0x80200,RVar25,
                  (uint)*(byte *)((long)&(pIVar40->field_0).op2 + 1) * 8 + 0x28);
      }
      else {
        pcStack_530 = (code *)0x138c80;
        emit_loadu64((ASMState *)local_508,RVar19,
                     *(uint64_t *)
                      ((long)*(IRIns *)(local_508._144_8_ + ((ulong)uVar16 + 1) * 8) + 0x28 +
                      (ulong)*(byte *)((long)&(pIVar40->field_0).op2 + 1) * 8));
      }
    }
    else {
      addr = (void *)(*(long *)((long)*(IRIns *)(local_508._144_8_ +
                                                ((long)(short)(pIVar40->field_0).op1 + 1) * 8) +
                                0x28 + (ulong)*(byte *)((long)&(pIVar40->field_0).op2 + 1) * 8) +
                     0x20);
      RVar25 = RVar25 | 0x80200;
      xVar38 = XO_MOV;
LAB_00138592:
      pcStack_530 = (code *)0x138597;
      emit_rma((ASMState *)local_508,xVar38,RVar25,addr);
    }
    goto switchD_00137213_caseD_c;
  case '>':
    pcStack_530 = (code *)0x13860a;
    uVar44 = ra_dest((ASMState *)local_508,pIVar40,0xbfef);
    pcStack_530 = (code *)0x13861d;
    asm_fusefref((ASMState *)local_508,pIVar40,0xbfef);
    xVar38 = XO_LEA;
    break;
  case '?':
    pcStack_530 = (code *)0x137c73;
    RVar25 = ra_dest((ASMState *)local_508,pIVar40,0xbfef);
    pcStack_530 = (code *)0x137c85;
    asm_tvptr((ASMState *)local_508,RVar25,(uint)(pIVar40->field_0).op1,(uint)(pIVar40->field_0).op2
             );
    goto switchD_00137213_caseD_c;
  case '@':
    pcStack_530 = (code *)0x137bd5;
    RVar25 = ra_dest((ASMState *)local_508,pIVar40,0xbfef);
    local_508[0xa4] = 0x80;
    local_508[0xa5] = 0x80;
    local_508[0xa6] = '\0';
    local_508._160_4_ = 0x18;
    RVar19 = (Reg)*(char *)(local_508._144_8_ + (ulong)(pIVar40->field_0).op1 * 8 + 6);
    if ((int)RVar19 < 0) {
      pcStack_530 = (code *)0x137c1a;
      RVar19 = ra_allocref((ASMState *)local_508,(uint)(pIVar40->field_0).op1,0xbfef);
    }
    uVar44 = uStack_458 & ~(1 << (RVar19 & 0x1f));
    uStack_458 = uVar44;
    local_508[0xa4] = (byte)RVar19;
    uVar16 = (pIVar40->field_0).op2;
    if ((short)uVar16 < 0) {
      uVar26 = (uint)*(char *)(local_508._144_8_ + (ulong)uVar16 * 8 + 6);
      if ((int)uVar26 < 0) {
        pcStack_530 = (code *)0x13933a;
        uVar26 = ra_allocref((ASMState *)local_508,(uint)uVar16,
                             ~(1 << ((byte)RVar19 & 0x1f)) & 0xbfef);
        uVar44 = uStack_458;
      }
      uStack_458 = uVar44 & ~(1 << (uVar26 & 0x1f));
      local_508[0xa5] = (char)uVar26;
    }
    else {
      local_508._160_4_ =
           local_508._160_4_ + (((IRIns *)(local_508._144_8_ + (ulong)uVar16 * 8))->field_1).op12;
    }
    uVar44 = RVar25 | 0x80200;
    xVar38 = XO_LEA;
    break;
  case 'A':
    pcStack_530 = (code *)0x137a80;
    RVar25 = ra_dest((ASMState *)local_508,pIVar40,0xbfef);
    pcStack_530 = (code *)0x137a8f;
    ra_left((ASMState *)local_508,RVar25,0x7fff);
    goto switchD_00137213_caseD_c;
  case 'B':
  case 'C':
  case 'D':
  case 'H':
    if ((char)(pIVar40->field_1).r < '\0') {
      bVar56 = (byte)(pIVar40->field_0).ot;
      if ((pIVar40->field_1).s != '\0') goto LAB_00137479;
      if ((bVar56 & 0x1f) - 3 < 10) {
        pcStack_530 = (code *)0x138bdd;
        RVar25 = ra_scratch((ASMState *)local_508,0xbfef);
        uVar35 = (ulong)RVar25;
        RVar58 = ~(1 << (RVar25 & 0x1f)) & 0xbfef;
      }
      else {
        RVar58 = 0xbfef;
        uVar35 = 0x80;
      }
      pcStack_530 = (code *)0x1397c4;
      asm_fuseahuref((ASMState *)local_508,(uint)(pIVar40->field_0).op1,RVar58);
      if ((pIVar40->field_1).o == 'H') {
        local_508._160_4_ = local_508._160_4_ + (uint)(pIVar40->field_0).op2 * 8;
      }
LAB_00137504:
      local_508._160_4_ = local_508._160_4_ + 4;
      pcStack_530 = (code *)0x13752a;
      asm_guardcc((ASMState *)local_508,(uint)(((pIVar40->field_1).t.irt & 0x1f) != 0xe) * 2 + 3);
      uVar44 = (pIVar40->field_1).t.irt & 0x1f;
      if ((byte)uVar44 < 0xe) {
        if (uVar44 - 3 < 10) {
          local_508._160_4_ = local_508._160_4_ - 4;
          *(byte *)(local_508._128_8_ + -1) = ~(pIVar40->field_1).t.irt | 0xe0;
          uVar44 = (uint)uVar35;
          pcStack_530 = (code *)0x1376c2;
          local_508._128_8_ = (byte *)(local_508._128_8_ + -1);
          emit_mrm((ASMState *)local_508,XO_ARITHi8,7,uVar44);
          *(byte *)(local_508._128_8_ + -1) = 0x2f;
          *(byte *)(local_508._128_8_ + -2) = (byte)uVar35 | 0xf8;
          *(byte *)(local_508._128_8_ + -3) = 0xc1;
          *(byte *)(local_508._128_8_ + -4) = (byte)(uVar35 >> 3) & 1 | 0x48;
          local_508._128_8_ = local_508._128_8_ + -4;
          goto LAB_0013770d;
        }
        if ((byte)uVar44 == 0) {
          local_508._160_4_ = local_508._160_4_ - 4;
          *(byte *)(local_508._128_8_ + -1) = 0xff;
          xVar38 = XO_ARITHi8;
          uVar44 = 0x80207;
          local_508._128_8_ = (byte *)(local_508._128_8_ + -1);
          break;
        }
        *(uint *)(local_508._128_8_ + -4) = ~uVar44 << 0xf | 0x7fff;
      }
      else {
        if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_0013b6a3;
        pbVar39 = (byte *)(local_508._128_8_ + -4);
        pbVar39[0] = 0;
        pbVar39[1] = 0;
        pbVar39[2] = 0xf9;
        pbVar39[3] = 0xff;
      }
      local_508._128_8_ = local_508._128_8_ + -4;
      xVar38 = XO_ARITHi;
      uVar44 = 7;
    }
    else {
      bVar56 = (pIVar40->field_1).t.irt;
LAB_00137479:
      RVar58 = 0xffff0000;
      if ((bVar56 & 0x1f) != 0xe) {
        RVar58 = 0xbfef;
      }
      pcStack_530 = (code *)0x13749a;
      uVar44 = ra_dest((ASMState *)local_508,pIVar40,RVar58);
      pcStack_530 = (code *)0x1374ad;
      asm_fuseahuref((ASMState *)local_508,(uint)(pIVar40->field_0).op1,0xbfef);
      if ((pIVar40->field_1).o == 'H') {
        local_508._160_4_ = local_508._160_4_ + (uint)(pIVar40->field_0).op2 * 8;
      }
      if (((pIVar40->field_1).t.irt & 0x1f) - 0xd < 0xfffffff6) {
        xVar38 = XO_MOVSD;
        if (uVar44 < 0x10) {
          xVar38 = XO_MOV;
        }
        pcStack_530 = (code *)0x1374f8;
        emit_mrm((ASMState *)local_508,xVar38,uVar44,0x20);
        uVar35 = 0x80;
        goto LAB_00137504;
      }
      *(byte *)(local_508._128_8_ + -1) = 0x11;
      bVar59 = (byte)uVar44 & 7;
      *(byte *)(local_508._128_8_ + -2) = bVar59 - 0x18;
      *(byte *)(local_508._128_8_ + -3) = 0xc1;
      uVar26 = uVar44 >> 3 & 1;
      bVar56 = (char)uVar26 + 0x48;
      *(byte *)(local_508._128_8_ + -4) = bVar56;
      local_508._128_8_ = local_508._128_8_ + -4;
      pcStack_530 = (code *)0x1375ca;
      asm_guardcc((ASMState *)local_508,5);
      *(byte *)(local_508._128_8_ + -1) = ~(pIVar40->field_1).t.irt | 0xe0;
      *(byte *)(local_508._128_8_ + -2) = (byte)uVar44 | 0xf8;
      *(byte *)(local_508._128_8_ + -3) = 0x83;
      lVar28 = -2;
      if (uVar26 != 0) {
        *(byte *)(local_508._128_8_ + -4) = 0x41;
        lVar28 = -3;
      }
      *(byte *)(local_508._128_8_ + lVar28 + -2) = 0x66;
      *(byte *)(local_508._128_8_ + lVar28 + -3) = 0x2f;
      if ((local_450 & 0x40) != 0) {
        xVar38 = 0xf0fbe3c4;
        local_508._128_8_ = (byte *)(local_508._128_8_ + lVar28 + -3);
        break;
      }
      *(byte *)(local_508._128_8_ + lVar28 + -4) = bVar59 | 200;
      *(byte *)(local_508._128_8_ + lVar28 + -5) = 0xc1;
      *(byte *)(local_508._128_8_ + lVar28 + -6) = bVar56;
      local_508._128_8_ = local_508._128_8_ + lVar28 + -6;
LAB_0013770d:
      uVar44 = uVar44 | 0x80200;
      xVar38 = XO_MOV;
    }
    break;
  case 'E':
  case 'F':
    pcStack_530 = (code *)0x137467;
    asm_fxload((ASMState *)local_508,pIVar40);
    goto switchD_00137213_caseD_c;
  case 'G':
    uVar16 = (pIVar40->field_0).op1;
    uVar34 = (uint)uVar16 * 8 + -0x10;
    bVar56 = (byte)(pIVar40->field_0).ot;
    if (((bVar56 & 0x9f) == 0x93 & (byte)(pIVar40->field_0).op2 >> 3) == 1) {
      pcStack_530 = (code *)0x1389af;
      RVar19 = ra_scratch((ASMState *)local_508,0xffff0000);
      pcStack_530 = (code *)0x1389bf;
      asm_tointg((ASMState *)local_508,pIVar40,RVar19);
      RVar25 = (Reg)*(char *)(local_508._144_8_ + 0x40006);
      if (*(char *)(local_508._144_8_ + 0x40006) < '\0') {
        pcStack_530 = (code *)0x1389e7;
        RVar25 = ra_allocref((ASMState *)local_508,0x8000,0xbfef);
      }
      bVar56 = (byte)RVar25 & 0x1f;
      uStack_458 = uStack_458 & (-2 << bVar56 | 0xfffffffeU >> 0x20 - bVar56);
      pcStack_530 = (code *)0x138a12;
      emit_rmro((ASMState *)local_508,XO_MOVSD,RVar19,RVar25,uVar34);
      bVar56 = 0xe;
    }
    else if (((char)(pIVar40->field_1).r < '\0') && ((pIVar40->field_1).s == '\0')) {
      if (((pIVar40->field_0).op2 & 4) == 0) goto switchD_00137213_caseD_c;
      RVar25 = (Reg)*(char *)(local_508._144_8_ + 0x40006);
      if (*(char *)(local_508._144_8_ + 0x40006) < '\0') {
        pcStack_530 = (code *)0x13a367;
        RVar25 = ra_allocref((ASMState *)local_508,0x8000,0xbfef);
      }
      bVar59 = (byte)RVar25 & 0x1f;
      uStack_458 = uStack_458 & (-2 << bVar59 | 0xfffffffeU >> 0x20 - bVar59);
    }
    else {
      local_528.i = uVar34;
      bVar59 = (byte)(bVar56 & 0x1f);
      RVar58 = 0xbfef;
      if (bVar59 == 0xe) {
        RVar58 = 0xffff0000;
      }
      pcStack_530 = (code *)0x13903a;
      RVar19 = ra_dest((ASMState *)local_508,pIVar40,RVar58);
      RVar25 = (Reg)*(char *)(local_508._144_8_ + 0x40006);
      if (*(char *)(local_508._144_8_ + 0x40006) < '\0') {
        pcStack_530 = (code *)0x139065;
        RVar25 = ra_allocref((ASMState *)local_508,0x8000,0xbfef);
      }
      bVar46 = (byte)RVar25 & 0x1f;
      uStack_458 = uStack_458 & (-2 << bVar46 | 0xfffffffeU >> 0x20 - bVar46);
      if (((pIVar40->field_0).op2 & 8) == 0) {
        if ((bVar56 & 0x1f) - 3 < 10) {
          *(byte *)(local_508._128_8_ + -1) = 0x11;
          bVar56 = (byte)RVar19 & 7;
          *(byte *)(local_508._128_8_ + -2) = bVar56 - 0x18;
          *(byte *)(local_508._128_8_ + -3) = 0xc1;
          uVar26 = RVar19 >> 3 & 1;
          uVar44 = uVar26 + 0x48;
          *(byte *)(local_508._128_8_ + -4) = (byte)uVar44;
          local_508._128_8_ = local_508._128_8_ + -4;
          if (((pIVar40->field_0).op2 & 4) != 0) {
            pcStack_530 = (code *)0x1390fc;
            local_520 = uVar44;
            asm_guardcc((ASMState *)local_508,5);
            *(byte *)(local_508._128_8_ + -1) = ~bVar59;
            *(byte *)(local_508._128_8_ + -2) = (byte)RVar19 | 0xf8;
            *(byte *)(local_508._128_8_ + -3) = 0x83;
            lVar28 = -2;
            if (uVar26 != 0) {
              *(byte *)(local_508._128_8_ + -4) = 0x41;
              lVar28 = -3;
            }
            local_508._128_8_ = local_508._128_8_ + lVar28 + -2;
            *(byte *)local_508._128_8_ = 0x66;
            uVar44 = local_520;
          }
          if ((local_450 & 0x40) == 0) {
            bVar61 = ((pIVar40->field_0).op2 & 4) == 0;
            bVar59 = 0x2f;
            if (bVar61) {
              bVar59 = 0x11;
            }
            bVar46 = 200;
            if (bVar61) {
              bVar46 = 0xe0;
            }
            *(byte *)(local_508._128_8_ + -1) = bVar59;
            *(byte *)(local_508._128_8_ + -2) = bVar46 | bVar56;
            *(byte *)(local_508._128_8_ + -3) = 0xc1;
            *(byte *)(local_508._128_8_ + -4) = (byte)uVar44;
            RVar19 = RVar19 | 0x80200;
            xVar38 = XO_MOV;
            local_508._128_8_ = (byte *)(local_508._128_8_ + -4);
          }
          else {
            *(byte *)(local_508._128_8_ + -1) = 0x2f;
            xVar38 = 0xf0fbe3c4;
            local_508._128_8_ = (byte *)(local_508._128_8_ + -1);
          }
          pcStack_530 = (code *)0x13a403;
          emit_rmro((ASMState *)local_508,xVar38,RVar19,RVar25,local_528._0_4_);
          goto switchD_00137213_caseD_c;
        }
        xVar38 = XO_MOV;
        if (bVar59 == 0xe) {
          xVar38 = XO_MOVSD;
        }
      }
      else {
        bVar56 = (bVar59 != 0x13) * '\x05' + 0xe;
        xVar38 = (uint)(bVar59 == 0x13) * 0x2000000 + XO_CVTSI2SD;
      }
      uVar34 = local_528._0_4_;
      pcStack_530 = (code *)0x13a09c;
      emit_rmro((ASMState *)local_508,xVar38,RVar19,RVar25,local_528._0_4_);
    }
    if (((pIVar40->field_0).op2 & 4) != 0) {
      bVar56 = bVar56 & 0x1f;
      pcStack_530 = (code *)0x13a0c7;
      asm_guardcc((ASMState *)local_508,(uint)(bVar56 != 0xe) * 2 + 3);
      if (bVar56 < 0xe) {
        uVar44 = 0xfffe7fff;
        if (((pIVar40->field_0).op2 & 0x40) == 0) {
          if (bVar56 == 0) {
            *(byte *)(local_508._128_8_ + -1) = 0xff;
            xVar38 = XO_ARITHi8;
            uVar44 = 0x80207;
            local_508._128_8_ = (byte *)(local_508._128_8_ + -1);
          }
          else {
            if (bVar56 < 3) {
              uVar44 = (int)(char)~bVar56 << 0xf | 0x7fff;
              goto LAB_0013a10f;
            }
            pcStack_530 = (code *)0x13a7c6;
            RVar19 = ra_scratch((ASMState *)local_508,~(1 << (RVar25 & 0x1f)) & 0xbfef);
            *(byte *)(local_508._128_8_ + -1) = ~bVar56;
            bVar56 = (byte)RVar19 | 0xf8;
            *(byte *)(local_508._128_8_ + -2) = bVar56;
            *(byte *)(local_508._128_8_ + -3) = 0x83;
            lVar28 = -2;
            uVar44 = RVar19 >> 3 & 1;
            if (uVar44 != 0) {
              *(byte *)(local_508._128_8_ + -4) = 0x41;
              lVar28 = -3;
            }
            *(byte *)(local_508._128_8_ + lVar28 + -2) = 0x2f;
            *(byte *)(local_508._128_8_ + lVar28 + -3) = bVar56;
            *(byte *)(local_508._128_8_ + lVar28 + -4) = 0xc1;
            *(byte *)(local_508._128_8_ + lVar28 + -5) = (byte)uVar44 | 0x48;
            uVar44 = RVar19 | 0x80200;
            xVar38 = XO_MOV;
            local_508._128_8_ = (byte *)(local_508._128_8_ + lVar28 + -5);
          }
          pcStack_530 = (code *)0x13a859;
          emit_rmro((ASMState *)local_508,xVar38,uVar44,RVar25,uVar34);
          goto switchD_00137213_caseD_c;
        }
      }
      else {
        uVar44 = 0xfffe7fff;
        if (((pIVar40->field_0).op2 & 0x40) == 0) {
          uVar44 = 0xfff90000;
        }
      }
LAB_0013a10f:
      *(uint *)(local_508._128_8_ + -4) = uVar44;
      local_508._128_8_ = local_508._128_8_ + -4;
      pcStack_530 = (code *)0x13a141;
      emit_rmro((ASMState *)local_508,XO_ARITHi,7,RVar25,(uint)uVar16 * 8 + -0xc);
    }
    goto switchD_00137213_caseD_c;
  case 'I':
    id_00 = (pIVar40->field_0).op2 == 0x7fff ^ IRCALL_lj_tab_len_hint;
LAB_00138eb7:
    pcStack_530 = (code *)0x138ec4;
    asm_callid((ASMState *)local_508,pIVar40,id_00);
    goto switchD_00137213_caseD_c;
  case 'J':
  case 'K':
  case 'L':
    if ((pIVar40->field_1).r == 0xfe) goto switchD_00137213_caseD_c;
    uVar16 = (pIVar40->field_0).op2;
    uVar35 = (ulong)uVar16;
    if (((pIVar40->field_1).t.irt & 0x1f) == 0xe) {
      cVar3 = *(char *)(local_508._144_8_ + uVar35 * 8 + 6);
      uVar44 = (uint)cVar3;
      if (cVar3 < '\0') {
        pcStack_530 = (code *)0x137278;
        uVar44 = ra_allocref((ASMState *)local_508,(uint)uVar16,0xffff0000);
      }
      bVar56 = (byte)uVar44 & 0x1f;
      uStack_458 = uStack_458 & (-2 << bVar56 | 0xfffffffeU >> 0x20 - bVar56);
      pcStack_530 = (code *)0x1372a1;
      asm_fuseahuref((ASMState *)local_508,(uint)(pIVar40->field_0).op1,0xbfef);
      xVar38 = XO_MOVSDto;
    }
    else if ((short)uVar16 < 0) {
      cVar3 = *(char *)(local_508._144_8_ + uVar35 * 8 + 6);
      RVar25 = (Reg)cVar3;
      if (cVar3 < '\0') {
        pcStack_530 = (code *)0x139805;
        RVar25 = ra_allocref((ASMState *)local_508,(uint)uVar16,0xbfef);
      }
      bVar56 = (byte)RVar25 & 0x1f;
      uStack_458 = uStack_458 & (-2 << bVar56 | 0xfffffffeU >> 0x20 - bVar56);
      pcStack_530 = (code *)0x13982f;
      asm_fuseahuref((ASMState *)local_508,(uint)(pIVar40->field_0).op1,
                     ~(1 << (RVar25 & 0x1f)) & 0xbfef);
      if (RVar25 < 0x80) {
        local_508._160_4_ = local_508._160_4_ + 4;
        *(int *)(local_508._128_8_ + -4) = (int)(char)(~(pIVar40->field_1).t.irt | 0xe0) << 0xf;
        local_508._128_8_ = local_508._128_8_ + -4;
        pcStack_530 = (code *)0x13987e;
        emit_mrm((ASMState *)local_508,XO_ARITHi,1,0x20);
        local_508._160_4_ = local_508._160_4_ - 4;
        uVar44 = RVar25 | 0x80200;
        xVar38 = XO_MOVto;
      }
      else {
        if (2 < (*(byte *)(uVar12 + uVar35 * 8 + 4) & 0x1f)) {
          *(IRRef2 *)(local_508._128_8_ + -4) = (((IRIns *)(uVar12 + uVar35 * 8))->field_1).op12;
          local_508._128_8_ = local_508._128_8_ + -4;
          pcStack_530 = (code *)0x139f03;
          emit_mrm((ASMState *)local_508,XO_MOVmi,0,0x20);
        }
        local_508._160_4_ = local_508._160_4_ + 4;
        pbVar39 = (byte *)(local_508._128_8_ + -4);
        pbVar39[0] = 0;
        pbVar39[1] = 0;
        pbVar39[2] = 0xf9;
        pbVar39[3] = 0xff;
        xVar38 = XO_MOVmi;
        uVar44 = 0;
        local_508._128_8_ = (byte *)(local_508._128_8_ + -4);
      }
    }
    else {
      pcStack_530 = (code *)0x138b19;
      lj_ir_kvalue(*(lua_State **)(local_508._152_8_ + 0x80),&local_138,
                   (IRIns *)(local_508._144_8_ + (ulong)uVar16 * 8));
      pcStack_530 = (code *)0x138b2a;
      asm_fuseahuref((ASMState *)local_508,(uint)(pIVar40->field_0).op1,0xbfef);
      if (CONCAT26(local_138.u64._6_2_,CONCAT24(local_138.u64._4_2_,local_138.field_4.i)) == -1) {
        uVar44 = 0x80200;
        uVar34 = 0xffffffff;
      }
      else {
        *(int32_t *)(local_508._128_8_ + -4) = local_138.field_4.i;
        local_508._128_8_ = local_508._128_8_ + -4;
        uVar44 = 0;
        pcStack_530 = (code *)0x138b67;
        emit_mrm((ASMState *)local_508,XO_MOVmi,0,0x20);
        local_508._160_4_ = local_508._160_4_ + 4;
        uVar34 = CONCAT22(local_138.u64._6_2_,local_138.u64._4_2_);
      }
      *(undefined4 *)(local_508._128_8_ + -4) = uVar34;
      xVar38 = XO_MOVmi;
      local_508._128_8_ = (byte *)(local_508._128_8_ + -4);
    }
    break;
  case 'M':
  case 'N':
    pcStack_530 = (code *)0x137455;
    asm_fxstore((ASMState *)local_508,pIVar40);
    goto switchD_00137213_caseD_c;
  case 'O':
  case 'P':
    pcStack_530 = (code *)0x137414;
    asm_snap_prep((ASMState *)local_508);
    aVar2 = pIVar40->field_0;
    auVar9._8_4_ = 0;
    auVar9._0_2_ = aVar2.op1;
    auVar9._2_2_ = aVar2.op2;
    auVar9._4_2_ = aVar2.ot;
    auVar9._6_2_ = aVar2.prev;
    auVar9._12_2_ = aVar2.prev;
    auVar10._8_2_ = aVar2.ot;
    auVar10._0_2_ = aVar2.op1;
    auVar10._2_2_ = aVar2.op2;
    auVar10._4_2_ = aVar2.ot;
    auVar10._6_2_ = aVar2.prev;
    auVar10._10_4_ = auVar9._10_4_;
    auVar11._6_8_ = 0;
    auVar11._0_6_ = auVar10._8_6_;
    local_138.u64._4_2_ = aVar2.op1;
    local_130 = (uint32_t)CONCAT82(SUB148(auVar11 << 0x40,6),aVar2.op2);
    local_404._4_4_ = local_404._4_4_ + 1;
    pCVar41 = lj_ir_callinfo + 2;
    goto LAB_0013881b;
  case 'Q':
    pcStack_530 = (code *)0x137ce4;
    asm_snap_prep((ASMState *)local_508);
    local_138.field_4.i = 0x7fff;
    local_138.u64._4_2_ = 0x7ffd;
    local_138.u64._6_2_ = 0;
    local_404._4_4_ = local_404._4_4_ + 1;
    pcStack_530 = (code *)0x137d14;
    asm_setupresult((ASMState *)local_508,pIVar40,lj_ir_callinfo + 0x20);
    pcStack_530 = (code *)0x137d22;
    asm_gencall((ASMState *)local_508,lj_ir_callinfo + 0x20,(IRRef *)&local_138.u64);
    RVar25 = (Reg)*(byte *)(local_508._144_8_ + 0x3ffee);
    iVar43 = 1 << (*(byte *)(local_508._144_8_ + 0x3ffee) & 0x1f);
    stack0xfffffffffffffba0 = CONCAT44(iVar43,iVar43) | stack0xfffffffffffffba0;
    *(undefined1 *)(local_508._144_8_ + 0x3ffee) = 0xff;
    uVar34 = (uint)(pIVar40->field_0).op2 << 0x18 | (uint)(pIVar40->field_0).op1;
    goto LAB_00139ebd;
  case 'R':
    pcStack_530 = (code *)0x1387f7;
    asm_snap_prep((ASMState *)local_508);
    local_138.u64._4_2_ = (pIVar40->field_0).op1;
    local_404._4_4_ = local_404._4_4_ + 1;
    pCVar41 = lj_ir_callinfo + 0x21;
LAB_0013881b:
    local_138.u64._6_2_ = 0;
    local_138.field_4.i = 0x7fff;
    pcStack_530 = (code *)0x138829;
    asm_setupresult((ASMState *)local_508,pIVar40,pCVar41);
    pcStack_530 = (code *)0x138837;
    asm_gencall((ASMState *)local_508,pCVar41,(IRRef *)&local_138.u64);
    goto switchD_00137213_caseD_c;
  case 'S':
  case 'T':
    id = (((IRIns *)(local_508._144_8_ + (ulong)(pIVar40->field_0).op1 * 8))->field_1).op12;
    pcStack_530 = (code *)0x137351;
    CVar17 = lj_ctype_info((CTState *)
                           ((jit_State *)(local_508._152_8_ + -0xc28))->penalty[0x3b].pc.ptr64,id,
                           (CTSize *)&local_168.i);
    local_404._4_4_ = local_404._4_4_ + 1;
    pcStack_530 = (code *)0x13736d;
    asm_setupresult((ASMState *)local_508,pIVar40,lj_ir_callinfo + 0x2a);
    if ((pIVar40->field_1).o == 'T') {
      uVar44 = 0x80200;
      if (local_168.field_1.op12 != 8) {
        uVar44 = 0;
      }
      uVar16 = (pIVar40->field_0).op2;
      uVar35 = (ulong)uVar16;
      bVar56 = (byte)(uVar44 >> 0x10);
      if ((short)uVar16 < 0) {
        cVar3 = *(char *)(local_508._144_8_ + uVar35 * 8 + 6);
        RVar25 = (Reg)cVar3;
        if (cVar3 < '\0') {
          pcStack_530 = (code *)0x139243;
          RVar25 = ra_allocref((ASMState *)local_508,(uint)uVar16,0xb028);
        }
        bVar59 = (byte)RVar25 & 0x1f;
        uStack_458 = uStack_458 & (-2 << bVar59 | 0xfffffffeU >> 0x20 - bVar59);
        *(byte *)(local_508._128_8_ + -1) = 0x10;
        *(byte *)(local_508._128_8_ + -2) = (byte)RVar25 * '\b' & 0x38 | 0x40;
        *(byte *)(local_508._128_8_ + -3) = 0x89;
        uVar44 = (RVar25 | uVar44) >> 1 & 0x104;
        if (uVar44 == 0) {
          local_508._128_8_ = local_508._128_8_ + -3;
        }
        else {
          *(byte *)(local_508._128_8_ + -4) = (byte)uVar44 | bVar56 | 0x40;
          local_508._128_8_ = local_508._128_8_ + -4;
        }
      }
      else {
        uVar26 = (uint)*(byte *)(local_508._144_8_ + uVar35 * 8 + 5);
        if ((uVar26 < 0x1e) && ((0x26000000U >> (uVar26 & 0x1f) & 1) != 0)) {
          u64 = *(IRIns *)(local_508._144_8_ + (uVar35 + 1) * 8);
        }
        else {
          u64.gcr.gcptr64._4_4_ = 0;
          u64.field_1.op12 = (((IRIns *)(local_508._144_8_ + uVar35 * 8))->field_1).op12;
        }
        if ((local_168.field_1.op12 == 4) || ((long)u64 + 0x80000000U >> 0x20 == 0)) {
          *(int32_t *)(local_508._128_8_ + -4) = u64.i;
          *(byte *)(local_508._128_8_ + -5) = 0x10;
          ((byte *)(local_508._128_8_ + -7))[0] = 199;
          ((byte *)(local_508._128_8_ + -7))[1] = 0x40;
          if ((uVar44 >> 9 & 1) == 0) {
            local_508._128_8_ = local_508._128_8_ + -7;
          }
          else {
            *(byte *)(local_508._128_8_ + -8) = bVar56 | 0x40;
            local_508._128_8_ = local_508._128_8_ + -8;
          }
        }
        else {
          *(byte *)(local_508._128_8_ + -1) = 0x10;
          ((byte *)(local_508._128_8_ + -3))[0] = 0x89;
          ((byte *)(local_508._128_8_ + -3))[1] = 0x48;
          if ((uVar44 >> 9 & 1) == 0) {
            local_508._128_8_ = local_508._128_8_ + -3;
          }
          else {
            *(byte *)(local_508._128_8_ + -4) = bVar56 | 0x40;
            local_508._128_8_ = local_508._128_8_ + -4;
          }
          pcStack_530 = (code *)0x139d0b;
          emit_loadu64((ASMState *)local_508,1,(uint64_t)u64);
        }
      }
    }
    else if ((pIVar40->field_0).op2 != 0x7fff) {
      local_138.field_4.i = 0x7fff;
      local_138.u64._4_2_ = (pIVar40->field_0).op1;
      local_138.u64._6_2_ = 0;
      local_12c = 0x7ffd;
      pcStack_530 = (code *)0x137786;
      local_130 = (uint)(pIVar40->field_0).op2;
      asm_gencall((ASMState *)local_508,lj_ir_callinfo + 0x65,(IRRef *)&local_138.u64);
      bVar56 = *(byte *)(local_508._144_8_ + 0x3ffee);
      iVar43 = 1 << (bVar56 & 0x1f);
      stack0xfffffffffffffba0 = CONCAT44(iVar43,iVar43) | stack0xfffffffffffffba0;
      *(undefined1 *)(local_508._144_8_ + 0x3ffee) = 0xff;
      pcStack_530 = (code *)0x1377d4;
      emit_loadi((ASMState *)local_508,(uint)bVar56,CVar17 >> 0x10 & 0xf);
      goto switchD_00137213_caseD_c;
    }
    *(byte *)(local_508._128_8_ + -1) = 8;
    ((byte *)(local_508._128_8_ + -3))[0] = 0x89;
    ((byte *)(local_508._128_8_ + -3))[1] = 0x48;
    *(CTypeID *)(local_508._128_8_ + -7) = id << 0x10 | 0xa00;
    *(byte *)(local_508._128_8_ + -8) = 0xc9;
    pbVar39 = (byte *)(local_508._128_8_ + -0xc);
    pbVar39[0] = 0x83;
    pbVar39[1] = 0xe1;
    pbVar39[2] = 3;
    pbVar39[3] = 0x81;
    local_508._128_8_ = local_508._128_8_ + -0xc;
    pcStack_530 = (code *)0x139e56;
    emit_rma((ASMState *)local_508,XO_MOVZXb,1,
             ((jit_State *)(local_508._152_8_ + -0xc28))->penalty + 0x25);
    local_138.field_4.i = 0x7fff;
    local_138.u64._4_2_ = 0x7ffd;
    local_138.u64._6_2_ = 0;
    pcStack_530 = (code *)0x139e7a;
    asm_gencall((ASMState *)local_508,lj_ir_callinfo + 0x2a,(IRRef *)&local_138.u64);
    RVar25 = (Reg)*(byte *)(local_508._144_8_ + 0x3ffee);
    iVar43 = 1 << (*(byte *)(local_508._144_8_ + 0x3ffee) & 0x1f);
    stack0xfffffffffffffba0 = CONCAT44(iVar43,iVar43) | stack0xfffffffffffffba0;
    *(undefined1 *)(local_508._144_8_ + 0x3ffee) = 0xff;
    uVar34 = local_168.field_1.op12 + 0x10;
LAB_00139ebd:
    pcStack_530 = (code *)0x139ec4;
    emit_loadi((ASMState *)local_508,RVar25,uVar34);
    goto switchD_00137213_caseD_c;
  case 'U':
    pcStack_530 = (code *)0x13795d;
    RVar25 = ra_dest((ASMState *)local_508,pIVar40,0xbfef);
    IVar47 = (pIVar40->field_0).op2;
    if (IVar47 == 2) {
      pcStack_530 = (code *)0x13993b;
      RVar19 = ra_scratch((ASMState *)local_508,~(1 << (RVar25 & 0x1f)) & 0xbfef);
      local_138.u64._4_2_ = 9;
      pcStack_530 = (code *)0x13995e;
      emit_storeofs((ASMState *)local_508,(IRIns *)&local_138,RVar19,RVar25,0x18);
      pcStack_530 = (code *)0x139982;
      emit_rma((ASMState *)local_508,XO_OR,RVar19 | 0x80200,
               ((jit_State *)(local_508._152_8_ + -0xc28))->penalty + 0x3a);
      *(byte *)(local_508._128_8_ + -1) = 7;
      *(byte *)(local_508._128_8_ + -2) = (byte)RVar19 & 7 | 0xe0;
      *(byte *)(local_508._128_8_ + -3) = 0x83;
      if ((RVar19 & 8) == 0) {
        local_508._128_8_ = local_508._128_8_ + -3;
      }
      else {
        *(byte *)(local_508._128_8_ + -4) = 0x41;
        local_508._128_8_ = local_508._128_8_ + -4;
      }
      iVar52 = 0x18;
LAB_00139f69:
      pcStack_530 = (code *)0x139f6e;
      emit_loadofs((ASMState *)local_508,(IRIns *)&local_138,RVar19,RVar25,iVar52);
    }
    else if (IVar47 == 1) {
      uVar16 = (pIVar40->field_0).op1;
      if (((*(char *)(local_508._144_8_ + (ulong)uVar16 * 8 + 6) < '\0') &&
          (pIVar22 = (IRIns *)(local_508._144_8_ + (ulong)uVar16 * 8), pIVar22 != pIVar40 + -1)) &&
         ((pIVar22 != pIVar40 + -2 ||
          ((-1 < *(char *)((long)pIVar40 + -2) || (*(char *)((long)pIVar40 + -1) != '\0')))))) {
        for (; ((pIVar22->field_1).o != 'U' || ((pIVar22->field_0).op2 != 0));
            pIVar22 = (IRIns *)(local_508._144_8_ + (ulong)(pIVar22->field_0).op1 * 8)) {
        }
        if (-1 < (short)(pIVar22->field_0).op1) {
          pcStack_530 = (code *)0x13990f;
          RVar19 = ra_allocref((ASMState *)local_508,(uint)uVar16,0xbfef);
          uStack_458 = uStack_458 | 1 << ((byte)RVar19 & 0x1f);
          pIVar40 = pIVar22;
        }
      }
    }
    else if (IVar47 == 0) {
      pcStack_530 = (code *)0x137992;
      RVar19 = ra_scratch((ASMState *)local_508,~(1 << (RVar25 & 0x1f)) & 0xbfef);
      local_138.u64._4_2_ = 9;
      pcStack_530 = (code *)0x1379b7;
      emit_storeofs((ASMState *)local_508,(IRIns *)&local_138,RVar19,RVar25,0);
      iVar52 = 0x10;
      goto LAB_00139f69;
    }
    pcStack_530 = (code *)0x139f7e;
    ra_left((ASMState *)local_508,RVar25,(uint)(pIVar40->field_0).op1);
    goto switchD_00137213_caseD_c;
  case 'V':
    local_138.field_4.i = (int32_t)(pIVar40->field_0).op1;
    local_138.u64._4_2_ = (pIVar40->field_0).op2;
    uVar35 = (ulong)(ushort)local_138.u64._4_2_;
    cVar3 = *(char *)(local_508._144_8_ + uVar35 * 8 + 5);
    if (cVar3 == '\x18') {
      if (*(int *)((long)*(IRIns *)(local_508._144_8_ + (uVar35 + 1) * 8) + 0x14) == 1) {
        local_528.field_1.op12 =
             (int)*(char *)((long)*(IRIns *)(local_508._144_8_ + (uVar35 + 1) * 8) + 0x18);
        pCVar41 = lj_ir_callinfo + 0x12;
LAB_00137b7c:
        local_138.u64._4_2_ = 0x7ffd;
        uVar42 = 0x7ffd;
        goto LAB_001399c1;
      }
LAB_001399b7:
      pCVar41 = lj_ir_callinfo + 0x11;
      local_528.field_1.op12 = 0xffffff7f;
      uVar42 = uVar35;
    }
    else {
      if (((ushort)local_138.u64._4_2_ <= local_410) ||
         (-1 < *(char *)(local_508._144_8_ + uVar35 * 8 + 6))) goto LAB_001399b7;
      if (cVar3 == 'O') {
        local_528.field_1.op12 = 0xffffff7f;
        local_138.u64._4_2_ = (((IRIns *)(local_508._144_8_ + uVar35 * 8))->field_0).op1;
        uVar42 = (ulong)(ushort)local_138.u64._4_2_;
        local_130 = (uint32_t)*(ushort *)(local_508._144_8_ + uVar35 * 8 + 2);
        pCVar41 = lj_ir_callinfo + 0x10;
      }
      else {
        if (cVar3 != ']') goto LAB_001399b7;
        sVar5 = *(short *)(local_508._144_8_ + uVar35 * 8 + 2);
        if (sVar5 == 1) {
          local_528.field_1.op12 = 0xffffff7f;
          pCVar41 = lj_ir_callinfo + 8;
          goto LAB_00137b7c;
        }
        local_528.field_1.op12 = 0xffffff7f;
        local_138.u64._4_2_ = (((IRIns *)(local_508._144_8_ + uVar35 * 8))->field_0).op1;
        uVar42 = (ulong)(ushort)local_138.u64._4_2_;
        pCVar41 = lj_ir_callinfo + 0x12;
        if (sVar5 == 0) {
          pCVar41 = lj_ir_callinfo + 7;
        }
      }
    }
LAB_001399c1:
    local_138.u64._6_2_ = 0;
    pcStack_530 = (code *)0x1399d4;
    asm_setupresult((ASMState *)local_508,pIVar40,pCVar41);
    pcStack_530 = (code *)0x1399e7;
    asm_gencall((ASMState *)local_508,pCVar41,(IRRef *)&local_138.u64);
    if ((int)uVar42 == 0x7ffd) {
      RVar25 = (Reg)*(byte *)(local_508._144_8_ + 0x3ffee);
      iVar43 = 1 << (*(byte *)(local_508._144_8_ + 0x3ffee) & 0x1f);
      stack0xfffffffffffffba0 = CONCAT44(iVar43,iVar43) | stack0xfffffffffffffba0;
      *(undefined1 *)(local_508._144_8_ + 0x3ffee) = 0xff;
      uVar34 = local_528._0_4_;
      if (local_528._0_4_ != 0xffffff7f) goto LAB_00139ebd;
      IVar33 = (IRRef)(((IRIns *)(uVar12 + uVar35 * 8))->field_0).op1;
      goto LAB_00139a45;
    }
    goto switchD_00137213_caseD_c;
  case 'W':
    local_138.field_4.i = (int32_t)(pIVar40->field_0).op1;
    local_404._4_4_ = local_404._4_4_ + 1;
    pcStack_530 = (code *)0x137bb5;
    asm_setupresult((ASMState *)local_508,pIVar40,lj_ir_callinfo + 0x1e);
    pCVar41 = lj_ir_callinfo + 0x1e;
LAB_001386c0:
    pcStack_530 = (code *)0x1386c8;
    asm_gencall((ASMState *)local_508,pCVar41,(IRRef *)&local_138.u64);
    goto switchD_00137213_caseD_c;
  case 'X':
    uVar44 = (uint)*(char *)(local_508._144_8_ + (ulong)(pIVar40->field_0).op1 * 8 + 6);
    if ((int)uVar44 < 0) {
      pcStack_530 = (code *)0x138873;
      uVar44 = ra_allocref((ASMState *)local_508,(uint)(pIVar40->field_0).op1,0xbfef);
    }
    bVar56 = (byte)uVar44 & 0x1f;
    uStack_458 = uStack_458 & (-2 << bVar56 | 0xfffffffeU >> 0x20 - bVar56);
    pcStack_530 = (code *)0x13889a;
    RVar25 = ra_scratch((ASMState *)local_508,~(1 << (uVar44 & 0x1f)) & 0xbfef);
    uVar12 = local_508._128_8_;
    pcStack_530 = (code *)0x1388c3;
    emit_rmro((ASMState *)local_508,XO_MOVto,RVar25 | 0x80200,uVar44,0x18);
    pcStack_530 = (code *)0x1388e7;
    emit_rma((ASMState *)local_508,XO_MOVto,uVar44 | 0x80200,
             ((jit_State *)(local_508._152_8_ + -0xc28))->penalty + 0x27);
    pcStack_530 = (code *)0x138900;
    emit_rma((ASMState *)local_508,XO_MOV,RVar25 | 0x80200,
             ((jit_State *)(local_508._152_8_ + -0xc28))->penalty + 0x27);
    *(byte *)(local_508._128_8_ + -1) = 0xfb;
    pcStack_530 = (code *)0x138930;
    local_508._128_8_ = (byte *)(local_508._128_8_ + -1);
    emit_rmro((ASMState *)local_508,XO_ARITHib,4,uVar44,8);
    *(char *)(local_508._128_8_ + -1) = (char)uVar12 - (char)local_508._128_8_;
    *(byte *)(local_508._128_8_ + -2) = 0x74;
    *(byte *)(local_508._128_8_ + -3) = 4;
    pcStack_530 = (code *)0x138968;
    local_508._128_8_ = (byte *)(local_508._128_8_ + -3);
    emit_rmro((ASMState *)local_508,XO_GROUP3b,0,uVar44,8);
    goto switchD_00137213_caseD_c;
  case 'Y':
    pcStack_530 = (code *)0x1377eb;
    ra_evictset((ASMState *)local_508,0xffff0fc7);
    uVar12 = local_508._128_8_;
    local_138.field_4.i = 0x7ffd;
    local_138.u64._4_2_ = (pIVar40->field_0).op1;
    local_138.u64._6_2_ = 0;
    pcStack_530 = (code *)0x137816;
    asm_gencall((ASMState *)local_508,lj_ir_callinfo + 0x29,(IRRef *)&local_138.u64);
    bVar56 = *(byte *)(local_508._144_8_ + 0x3ffee);
    iVar43 = 1 << (bVar56 & 0x1f);
    stack0xfffffffffffffba0 = CONCAT44(iVar43,iVar43) | stack0xfffffffffffffba0;
    *(undefined1 *)(local_508._144_8_ + 0x3ffee) = 0xff;
    pcStack_530 = (code *)0x137869;
    emit_loadu64((ASMState *)local_508,(uint)bVar56,
                 (uint64_t)(((jit_State *)(local_508._152_8_ + -0xc28))->penalty + 0x23));
    bVar56 = *(byte *)(local_508._144_8_ + (ulong)(pIVar40->field_0).op1 * 8 + 6);
    *(char *)(local_508._128_8_ + -1) = (char)uVar12 - (char)local_508._128_8_;
    *(byte *)(local_508._128_8_ + -2) = 0x74;
    pbVar39 = (byte *)(local_508._128_8_ + -3);
    *(byte *)(local_508._128_8_ + -3) = 3;
    uVar16 = (pIVar40->field_0).op2;
    local_508._128_8_ = pbVar39;
    if ((short)uVar16 < 0) {
      cVar3 = *(char *)(local_508._144_8_ + (ulong)uVar16 * 8 + 6);
      RVar25 = (Reg)cVar3;
      if (cVar3 < '\0') {
        pcStack_530 = (code *)0x1392b7;
        RVar25 = ra_allocref((ASMState *)local_508,(uint)uVar16,~(1 << (bVar56 & 0x1f)) & 0xfc7);
      }
      bVar59 = (byte)RVar25 & 0x1f;
      uStack_458 = uStack_458 & (-2 << bVar59 | 0xfffffffeU >> 0x20 - bVar59);
      pcStack_530 = (code *)0x1392dd;
      emit_rmro((ASMState *)local_508,XO_GROUP3b,0,RVar25,8);
    }
    else {
      pcStack_530 = (code *)0x1378c9;
      emit_rma((ASMState *)local_508,XO_GROUP3b,0,
               (void *)((long)*(IRIns *)(local_508._144_8_ + ((ulong)uVar16 + 1) * 8) + 8));
    }
    *(char *)(local_508._128_8_ + -1) = (char)uVar12 - (char)local_508._128_8_;
    *(byte *)(local_508._128_8_ + -2) = 0x74;
    *(byte *)(local_508._128_8_ + -3) = 4;
    pcStack_530 = (code *)0x139317;
    local_508._128_8_ = (byte *)(local_508._128_8_ + -3);
    emit_rmro((ASMState *)local_508,XO_GROUP3b,0,(uint)bVar56,-8);
    goto switchD_00137213_caseD_c;
  case '[':
    uVar26 = (pIVar40->field_0).op2 & 0x1f;
    uVar31 = (ushort)uVar26;
    bVar61 = (ushort)(uVar31 - 0x15) < 2;
    uVar16 = (pIVar40->field_0).op1;
    IVar45.gcr.gcptr64._2_6_ = 0;
    IVar45.field_0.op1 = uVar16;
    bVar56 = (byte)(pIVar40->field_0).ot;
    uVar44 = bVar56 & 0x1f;
    if ((byte)((char)uVar44 - 0xdU) < 2) {
      pcStack_530 = (code *)0x138794;
      local_528 = IVar45;
      RVar25 = ra_dest((ASMState *)local_508,pIVar40,0xffff0000);
      IVar33 = local_528.field_1.op12;
      if ((ushort)(uVar31 - 0xd) < 2) {
        pcStack_530 = (code *)0x1387c2;
        RVar19 = asm_fuseload((ASMState *)local_508,IVar33,0xffff0000);
        pcStack_530 = (code *)0x1387dc;
        emit_mrm((ASMState *)local_508,(uint)(uVar31 != 0xe) << 8 | XO_CVTSD2SS,RVar25,RVar19);
        if (RVar19 == RVar25) goto switchD_00137213_caseD_c;
      }
      else {
        uVar44 = (uint)(uVar26 == 9 || bVar61);
        if ((uVar26 | 2) == 0x16) {
          cVar3 = *(char *)(local_508._144_8_ + ((ulong)local_528 & 0xffffffff) * 8 + 6);
          RVar19 = (Reg)cVar3;
          if (cVar3 < '\0') {
            pcStack_530 = (code *)0x139ab5;
            RVar19 = ra_allocref((ASMState *)local_508,IVar33,0xbfef);
          }
          bVar56 = (byte)RVar19 & 0x1f;
          uStack_458 = uStack_458 & (-2 << bVar56 | 0xfffffffeU >> 0x20 - bVar56);
        }
        else {
          pcStack_530 = (code *)0x13a22c;
          RVar19 = asm_fuseloadm((ASMState *)local_508,IVar33,0xbfef,uVar44);
        }
        uVar12 = local_508._128_8_;
        if (uVar31 == 0x16) {
          pcStack_530 = (code *)0x13a25a;
          emit_rma((ASMState *)local_508,XO_ADDSD,RVar25,(TValue *)(local_508._152_8_ + 0x130) + 1);
          *(char *)(local_508._128_8_ + -1) = (char)uVar12 - (char)local_508._128_8_;
          *(byte *)(local_508._128_8_ + -2) = 0x79;
          *(byte *)(local_508._128_8_ + -3) = ((byte)RVar19 & 7) + (byte)RVar19 * '\b' | 0xc0;
          *(byte *)(local_508._128_8_ + -4) = 0x85;
          *(byte *)(local_508._128_8_ + -5) =
               (byte)(RVar19 >> 0x10) | (byte)(RVar19 >> 1) & 4 | (byte)(RVar19 >> 3) & 1 | 0x48;
          local_508._128_8_ = local_508._128_8_ + -5;
        }
        if (uVar26 == 9 || bVar61) {
          uVar44 = 0x80200;
        }
        if (uVar31 == 0x14) {
          uVar44 = 0x80200;
        }
        pcStack_530 = (code *)0x13a2f1;
        emit_mrm((ASMState *)local_508,
                 (uint)(((pIVar40->field_1).t.irt & 0x1f) != 0xe) << 8 | XO_CVTSI2SD,uVar44 | RVar25
                 ,RVar19);
      }
      *(byte *)(local_508._128_8_ + -1) = ((byte)RVar25 & 7) + (byte)RVar25 * '\b' | 0xc0;
      ((byte *)(local_508._128_8_ + -3))[0] = 0xf;
      ((byte *)(local_508._128_8_ + -3))[1] = 0x57;
      uVar44 = RVar25 >> 3 & 1 | RVar25 >> 1 & 4;
      if (uVar44 == 0) {
        local_508._128_8_ = local_508._128_8_ + -3;
      }
      else {
        *(byte *)(local_508._128_8_ + -4) = (byte)uVar44 | 0x40;
        local_508._128_8_ = local_508._128_8_ + -4;
      }
LAB_0013a779:
      goto switchD_00137213_caseD_c;
    }
    if ((ushort)(uVar31 - 0xd) < 2) {
      if ((char)bVar56 < '\0') {
        cVar3 = *(char *)(local_508._144_8_ + (long)IVar45 * 8 + 6);
        RVar25 = (Reg)cVar3;
        if (cVar3 < '\0') {
          pcStack_530 = (code *)0x13a166;
          RVar25 = ra_allocref((ASMState *)local_508,(uint)uVar16,0xffff0000);
        }
        bVar56 = (byte)RVar25 & 0x1f;
        uStack_458 = uStack_458 & (-2 << bVar56 | 0xfffffffeU >> 0x20 - bVar56);
        pcStack_530 = (code *)0x13a184;
        asm_tointg((ASMState *)local_508,pIVar40,RVar25);
        goto switchD_00137213_caseD_c;
      }
      pcStack_530 = (code *)0x138fa7;
      RVar25 = ra_dest((ASMState *)local_508,pIVar40,0xbfef);
      xVar38 = (uint)(uVar31 != 0xe) << 8 | XO_CVTTSD2SI;
      uVar44 = (pIVar40->field_1).t.irt & 0x1f;
      bVar56 = (byte)RVar25;
      if (uVar44 == 0x14) {
        *(byte *)(local_508._128_8_ + -1) = (bVar56 & 7) + bVar56 * '\b' | 0xc0;
        *(byte *)(local_508._128_8_ + -2) = 0x8b;
        uVar44 = RVar25 >> 3 & 1 | RVar25 >> 1 & 4;
        if (uVar44 == 0) {
          local_508._128_8_ = local_508._128_8_ + -2;
        }
        else {
          *(byte *)(local_508._128_8_ + -3) = (byte)uVar44 | 0x40;
          local_508._128_8_ = local_508._128_8_ + -3;
        }
        uVar44 = (uint)((pIVar40->field_1).t.irt & 0x1f);
      }
      else if (uVar44 == 0x16) {
        if (*(char *)(local_508._144_8_ + (long)IVar45 * 8 + 6) < '\0') {
          pcStack_530 = (code *)0x13a98c;
          local_528 = IVar45;
          RVar19 = ra_allocref((ASMState *)local_508,(uint)uVar16,0xffff0000);
          bVar59 = (byte)RVar19 & 0x1f;
          uStack_458 = uStack_458 & (-2 << bVar59 | 0xfffffffeU >> 0x20 - bVar59);
        }
        else {
          pcStack_530 = (code *)0x138ff5;
          local_528 = IVar45;
          RVar19 = ra_scratch((ASMState *)local_508,0xffff0000);
        }
        uVar12 = local_508._128_8_;
        pcStack_530 = (code *)0x13a9c2;
        emit_rr((ASMState *)local_508,xVar38,RVar25 | 0x80200,RVar19);
        lVar28 = 0x104;
        if (uVar31 == 0xe) {
          lVar28 = 0x140;
        }
        pcStack_530 = (code *)0x13a9fc;
        emit_rma((ASMState *)local_508,(uint)(uVar31 != 0xe) << 8 | XO_ADDSD,RVar19,
                 (void *)((long)&(((GCtrace *)local_508._152_8_)->nextgc).gcptr64 + lVar28));
        *(char *)(local_508._128_8_ + -1) = (char)uVar12 - (char)local_508._128_8_;
        *(byte *)(local_508._128_8_ + -2) = 0x79;
        *(byte *)(local_508._128_8_ + -3) = (bVar56 & 7) + bVar56 * '\b' | 0xc0;
        *(byte *)(local_508._128_8_ + -4) = 0x85;
        *(byte *)(local_508._128_8_ + -5) = (byte)(RVar25 >> 3) & 1 | (byte)(RVar25 >> 1) & 4 | 0x48
        ;
        local_508._128_8_ = local_508._128_8_ + -5;
        pcStack_530 = (code *)0x13aa59;
        emit_rr((ASMState *)local_508,xVar38,RVar25 | 0x80200,RVar19);
        pcStack_530 = (code *)0x13aa68;
        ra_left((ASMState *)local_508,RVar19,local_528.i);
        goto switchD_00137213_caseD_c;
      }
      uVar26 = 0;
      if ((char)uVar44 == '\x14') {
        uVar26 = 0x80200;
      }
      if ((0x605fd9U >> uVar44 & 1) != 0) {
        uVar26 = 0x80200;
      }
      RVar25 = uVar26 | RVar25;
      pcStack_530 = (code *)0x13aab0;
      RVar19 = asm_fuseload((ASMState *)local_508,(uint)uVar16,0xffff0000);
    }
    else if ((ushort)(uVar31 - 0xf) < 4) {
      pcStack_530 = (code *)0x139af5;
      RVar25 = ra_dest((ASMState *)local_508,pIVar40,0xbfef);
      if (uVar31 == 0x11) {
        xVar38 = XO_MOVSXw;
      }
      else if (uVar26 == 0x10) {
        RVar25 = RVar25 | 0x200;
        xVar38 = XO_MOVZXb;
      }
      else if (uVar26 == 0xf) {
        RVar25 = RVar25 | 0x200;
        xVar38 = XO_MOVSXb;
      }
      else {
        xVar38 = XO_MOVZXw;
      }
      pcStack_530 = (code *)0x13a8b9;
      RVar19 = asm_fuseload((ASMState *)local_508,(uint)uVar16,0xbfef);
    }
    else {
      pcStack_530 = (code *)0x13a01d;
      RVar25 = ra_dest((ASMState *)local_508,pIVar40,0xbfef);
      if ((0x605fd9U >> uVar44 & 1) == 0) {
        if (((uVar31 < 0x17) && ((0x600200U >> uVar26 & 1) != 0)) &&
           (((pIVar40->field_0).op2 & 0x1000) == 0)) {
          pcStack_530 = (code *)0x13a067;
          RVar19 = asm_fuseload((ASMState *)local_508,(uint)uVar16,0xbfef);
          xVar38 = XO_MOV;
          goto LAB_0013866e;
        }
LAB_0013a39a:
        pcStack_530 = (code *)0x13a3aa;
        ra_left((ASMState *)local_508,RVar25,(uint)uVar16);
        goto switchD_00137213_caseD_c;
      }
      if (((uVar31 < 0x17) && ((0x600200U >> uVar26 & 1) != 0)) ||
         (((pIVar40->field_0).op2 & 0x800) == 0)) goto LAB_0013a39a;
      pcStack_530 = (code *)0x13ab09;
      RVar19 = asm_fuseload((ASMState *)local_508,(uint)uVar16,0xbfef);
      RVar25 = RVar25 | 0x80200;
      xVar38 = XO_MOVSXd;
    }
LAB_0013866e:
    pcStack_530 = (code *)0x138675;
    emit_mrm((ASMState *)local_508,xVar38,RVar25,RVar19);
    goto switchD_00137213_caseD_c;
  case '\\':
    pcStack_530 = (code *)0x137c9f;
    RVar25 = ra_dest((ASMState *)local_508,pIVar40,0xbfef);
    if (*(char *)(local_508._144_8_ + (ulong)(pIVar40->field_0).op1 * 8 + 6) < '\0') {
      pcStack_530 = (code *)0x1393a0;
      uVar44 = ra_allocref((ASMState *)local_508,(uint)(pIVar40->field_0).op1,0xffff0000);
      bVar56 = (byte)uVar44;
      uStack_458 = uStack_458 & (-2 << (bVar56 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar56 & 0x1f));
    }
    else {
      pcStack_530 = (code *)0x137cc7;
      uVar44 = ra_scratch((ASMState *)local_508,0xffff0000);
      bVar56 = (byte)uVar44;
    }
    *(byte *)(local_508._128_8_ + -1) = ((byte)RVar25 & 7) + (char)uVar44 * '\b' | 0xc0;
    pbVar39 = (byte *)(local_508._128_8_ + -5);
    pbVar39[0] = 0xfc;
    pbVar39[1] = 0x66;
    pbVar39[2] = 0xf;
    pbVar39[3] = 0x7e;
    uVar26 = RVar25 >> 3 & 1 | uVar44 >> 1 & 4;
    pbVar39 = (byte *)(local_508._128_8_ + -4);
    if (uVar26 != 0) {
      pbVar39 = (byte *)(local_508._128_8_ + -5);
      *(byte *)(local_508._128_8_ + -4) = (byte)uVar26 | 0x40;
      *pbVar39 = 0x66;
    }
    pcStack_530 = (code *)0x139420;
    local_508._128_8_ = pbVar39;
    RVar25 = asm_fuseload((ASMState *)local_508,(uint)(pIVar40->field_0).op2,
                          ~(1 << (bVar56 & 0x1f)) & 0xffff0000);
    pcStack_530 = (code *)0x139431;
    emit_mrm((ASMState *)local_508,XO_ADDSD,uVar44,RVar25);
    pcStack_530 = (code *)0x13943f;
    ra_left((ASMState *)local_508,uVar44,(uint)(pIVar40->field_0).op1);
    goto switchD_00137213_caseD_c;
  case ']':
    pcStack_530 = (code *)0x1386da;
    asm_snap_prep((ASMState *)local_508);
    local_404._4_4_ = local_404._4_4_ + 1;
    local_138.field_4.i = 0x7fff;
    if ((pIVar40->field_0).op2 == 1) {
      pCVar41 = lj_ir_callinfo + 5;
      local_138.u64._4_2_ = 0x7ffd;
    }
    else {
      local_138.u64._4_2_ = (pIVar40->field_0).op1;
      pCVar41 = lj_ir_callinfo + (ulong)((pIVar40->field_0).op2 != 0) * 2 + 4;
    }
    local_138.u64._6_2_ = 0;
    pcStack_530 = (code *)0x138f06;
    asm_setupresult((ASMState *)local_508,pIVar40,pCVar41);
    pcStack_530 = (code *)0x138f14;
    asm_gencall((ASMState *)local_508,pCVar41,(IRRef *)&local_138.u64);
    if ((pIVar40->field_0).op2 == 1) {
      RVar25 = (Reg)*(byte *)(local_508._144_8_ + 0x3ffee);
      iVar43 = 1 << (*(byte *)(local_508._144_8_ + 0x3ffee) & 0x1f);
      stack0xfffffffffffffba0 = CONCAT44(iVar43,iVar43) | stack0xfffffffffffffba0;
      *(undefined1 *)(local_508._144_8_ + 0x3ffee) = 0xff;
      IVar33 = (IRRef)(pIVar40->field_0).op1;
LAB_00139a45:
      pcStack_530 = (code *)0x139a51;
      asm_tvptr((ASMState *)local_508,RVar25,IVar33,1);
    }
    goto switchD_00137213_caseD_c;
  case '^':
    pcStack_530 = (code *)0x138a2c;
    ra_evictset((ASMState *)local_508,0xffff0fc7);
    pcStack_530 = (code *)0x138a39;
    asm_guardcc((ASMState *)local_508,4);
    ((byte *)(local_508._128_8_ + -2))[0] = 0x85;
    ((byte *)(local_508._128_8_ + -2))[1] = 0xc0;
    local_508._128_8_ = local_508._128_8_ + -2;
    local_138.field_4.i = (int32_t)(pIVar40->field_0).op1;
    local_138.u64._4_2_ = 0x7ffd;
    local_138.u64._6_2_ = 0;
    pcStack_530 = (code *)0x138a75;
    asm_gencall((ASMState *)local_508,lj_ir_callinfo + 3,(IRRef *)&local_138.u64);
    bVar56 = *(byte *)(local_508._144_8_ + 0x3ffee);
    iVar43 = 1 << (bVar56 & 0x1f);
    stack0xfffffffffffffba0 = CONCAT44(iVar43,iVar43) | stack0xfffffffffffffba0;
    *(undefined1 *)(local_508._144_8_ + 0x3ffee) = 0xff;
    pcStack_530 = (code *)0x138ad1;
    emit_rmro((ASMState *)local_508,XO_LEA,bVar56 | 0x80200,4,(uint)(pIVar40->field_1).s << 2);
    goto switchD_00137213_caseD_c;
  case '_':
  case 'a':
  case 'b':
    goto switchD_00137213_caseD_5f;
  case '`':
    local_404._4_4_ = local_404._4_4_ + 1;
switchD_00137213_caseD_5f:
    uVar16 = (pIVar40->field_0).op2;
    pcStack_530 = (code *)0x1385d4;
    asm_collectargs((ASMState *)local_508,pIVar40,(CCallInfo *)(ulong)lj_ir_callinfo[uVar16].flags,
                    (IRRef *)&local_138.u64);
    pcStack_530 = (code *)0x1385e2;
    asm_setupresult((ASMState *)local_508,pIVar40,lj_ir_callinfo + uVar16);
    pcStack_530 = (code *)0x1385f0;
    asm_gencall((ASMState *)local_508,lj_ir_callinfo + uVar16,(IRRef *)&local_138.u64);
    goto switchD_00137213_caseD_c;
  case 'c':
    pcStack_530 = (code *)0x1378de;
    local_160 = asm_callx_flags((ASMState *)local_508,pIVar40);
    pcStack_530 = (code *)0x1378ff;
    asm_collectargs((ASMState *)local_508,pIVar40,(CCallInfo *)(ulong)local_160,
                    (IRRef *)&local_138.u64);
    pcStack_530 = (code *)0x13790d;
    asm_setupresult((ASMState *)local_508,pIVar40,(CCallInfo *)&local_168.field_0);
    uVar35 = (ulong)(pIVar40->field_0).op2;
    pIVar40 = (IRIns *)(local_508._144_8_ + uVar35 * 8);
    if ((pIVar40->field_1).o == 'd') {
      uVar35 = (ulong)(pIVar40->field_0).op1;
      pIVar40 = (IRIns *)(local_508._144_8_ + uVar35 * 8);
    }
    if ((short)uVar35 < 0) {
LAB_001396c1:
      local_168 = (IRIns)0x0;
LAB_001396cd:
      cVar3 = *(char *)(local_508._144_8_ + uVar35 * 8 + 6);
      RVar25 = (Reg)cVar3;
      if (cVar3 < '\0') {
        pcStack_530 = (code *)0x1396ea;
        RVar25 = ra_allocref((ASMState *)local_508,(IRRef)uVar35,0xb028);
      }
      bVar56 = (byte)RVar25 & 0x1f;
      uStack_458 = uStack_458 & (-2 << bVar56 | 0xfffffffeU >> 0x20 - bVar56);
      *(byte *)(local_508._128_8_ + -1) = (byte)RVar25 & 7 | 0xd0;
      *(byte *)(local_508._128_8_ + -2) = 0xff;
      if ((RVar25 & 8) == 0) {
        local_508._128_8_ = local_508._128_8_ + -2;
      }
      else {
        *(byte *)(local_508._128_8_ + -3) = 0x41;
        local_508._128_8_ = local_508._128_8_ + -3;
      }
    }
    else {
      if ((pIVar40->field_1).o == '\x1d') {
        local_168 = pIVar40[1];
      }
      else {
        local_168.gcr.gcptr64._4_4_ = 0;
        local_168.field_1.op12 = (pIVar40->field_1).op12;
      }
      if ((long)(int)((long)local_168 - local_508._128_8_) != (long)local_168 - local_508._128_8_)
      goto LAB_001396c1;
      if (local_168 == (IRIns)0x0) goto LAB_001396cd;
    }
    pcStack_530 = (code *)0x139746;
    asm_gencall((ASMState *)local_508,(CCallInfo *)&local_168.field_0,(IRRef *)&local_138.u64);
    goto switchD_00137213_caseD_c;
  }
  pcStack_530 = (code *)0x139c70;
  emit_mrm((ASMState *)local_508,xVar38,uVar44,0x20);
  goto switchD_00137213_caseD_c;
LAB_0013abf0:
  if ((local_3b8 == (byte *)0x0) ||
     (pGVar21 = local_150->curfinal, J = local_150, pGVar21->nins < local_148->nins)) {
    if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) {
LAB_0013b6a3:
      pcStack_530 = (code *)0x13b6ad;
      asm_mclimit((ASMState *)local_508);
    }
    if (0 < local_404._4_4_) {
      local_440 = (IRRef)local_3f8->snap->ref;
      pcStack_530 = (code *)0x13ac69;
      asm_snap_prep((ASMState *)local_508);
      pcStack_530 = (code *)0x13ac71;
      asm_gc_check((ASMState *)local_508);
      local_440 = local_43c;
    }
    if ((uint)local_508._168_4_ < 0xffff0000) {
      uVar44 = ~local_508._168_4_ & 0xffff0000;
      do {
        uVar26 = 0;
        if (uVar44 != 0) {
          for (; (uVar44 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
          }
        }
        if (*(ushort *)(local_508 + (ulong)uVar26 * 4) < 0x8000) {
          pcStack_530 = (code *)0x13acb0;
          ra_rematk((ASMState *)local_508,(uint)*(ushort *)(local_508 + (ulong)uVar26 * 4));
          if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_0013b6a3;
        }
        bVar56 = (byte)uVar26 & 0x1f;
        uVar44 = uVar44 & (-2 << bVar56 | 0xfffffffeU >> 0x20 - bVar56);
      } while (uVar44 != 0);
    }
    if ((local_508._168_4_ & 0xbfef) != 0xbfef) {
      uVar44 = local_508._168_4_ & 0xbfef ^ 0xbfef;
      do {
        uVar26 = 0;
        if (uVar44 != 0) {
          for (; (uVar44 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
          }
        }
        if (*(ushort *)(local_508 + (ulong)uVar26 * 4) < 0x8000) {
          pcStack_530 = (code *)0x13ad05;
          ra_rematk((ASMState *)local_508,(uint)*(ushort *)(local_508 + (ulong)uVar26 * 4));
          if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_0013b6a3;
        }
        bVar56 = (byte)uVar26 & 0x1f;
        uVar44 = uVar44 & (-2 << bVar56 | 0xfffffffeU >> 0x20 - bVar56);
      } while (uVar44 != 0);
    }
    auVar13 = stack0xfffffffffffffba0;
    if (local_3f0 != (GCtrace *)0x0) {
      pIVar40 = local_3f0->ir;
      if ((local_42c != 0) && (local_3f0->topslot < (BCReg)local_404)) {
        pcStack_530 = (code *)0x13ad60;
        asm_snap_alloc((ASMState *)local_508,0);
      }
      bVar56 = *(byte *)(local_508._144_8_ + 0x40006);
      uVar44 = 0x80;
      if (-1 < (char)bVar56) {
        uVar44 = (uint)bVar56;
        uVar26 = local_508._168_4_ | 1 << (uVar44 & 0x1f);
        RVar58 = RStack_45c;
        local_508._168_4_ = uVar26;
        if (((RVar58 >> (uVar44 & 0x1f) & 1) != 0) ||
           ((*(byte *)(local_508._144_8_ + 0x40004) & 0x20) != 0)) {
          *(undefined1 *)(local_508._144_8_ + 0x40006) = 0xff;
        }
        bVar59 = *(byte *)((long)pIVar40 + 0x40006);
        if (bVar59 != bVar56) {
          if (((char)bVar59 < '\0') || ((uVar26 >> (bVar59 & 0x1f) & 1) == 0)) {
            pcStack_530 = (code *)0x13af57;
            emit_rma((ASMState *)local_508,XO_MOV,uVar44 | 0x80200,
                     &((jit_State *)(local_508._152_8_ + -0xc28))->penalty[0x3a].val);
            uVar44 = 0x80;
          }
          else {
            *(byte *)(local_508._128_8_ + -1) = bVar59 & 7 | bVar56 * '\b' | 0xc0;
            *(byte *)(local_508._128_8_ + -2) = 0x8b;
            *(byte *)(local_508._128_8_ + -3) = bVar59 >> 3 & 1 | bVar56 >> 1 & 4 | 0x48;
            local_508._128_8_ = (byte *)(local_508._128_8_ + -3);
            uVar44 = (uint)*(byte *)((long)pIVar40 + 0x40006);
          }
        }
      }
      bVar56 = (byte)uVar44 & 0x1f;
      uVar34 = -2 << bVar56 | 0xfffffffeU >> 0x20 - bVar56;
      uVar26 = uVar34 & 0xbfef;
      if (uVar44 == 0x80) {
        uVar26 = 0xbfef;
      }
      local_518 = CONCAT44(local_518._4_4_,uVar26);
      if (uVar44 == 0x80) {
        uVar34 = 0xffffbfef;
      }
      uVar35 = (ulong)local_43c;
      if (uVar35 < 0x8001) {
        iVar43 = 0;
        bVar61 = true;
        local_520 = 0;
      }
      else {
        puVar29 = auStack_10372 + uVar35;
        lVar28 = uVar35 << 3;
        local_520 = 0;
        local_178 = (IRIns *)((ulong)local_178 & 0xffffffff00000000);
        local_51c = 0;
        local_510 = pIVar40;
        do {
          uVar12 = local_508._144_8_;
          uVar16 = *puVar29;
          bVar56 = *(byte *)(local_508._144_8_ + lVar28 + 6);
          uVar31 = (ushort)bVar56;
          if ((char)bVar56 < '\0') {
            if (*(char *)(local_508._144_8_ + lVar28 + 7) != '\0') {
              pbVar39 = (byte *)(local_508._144_8_ + lVar28 + 4);
              *pbVar39 = *pbVar39 | 0x20;
              local_178 = (IRIns *)CONCAT44(local_178._4_4_,1);
            }
          }
          else {
            uVar34 = uVar34 & ~(1 << (bVar56 & 0x1f));
            bVar59 = *(byte *)(local_508._144_8_ + lVar28 + 7);
            if (bVar59 != 0) {
              local_528.field_1.op12 = uVar34;
              local_518 = CONCAT44(local_518._4_4_,uVar26);
              pIVar40 = (IRIns *)(lVar28 + local_508._144_8_);
              pcStack_530 = (code *)0x13b01e;
              emit_storeofs((ASMState *)local_508,pIVar40,(uint)bVar56,4,(uint)bVar59 << 2);
              if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_0013b6a3;
              bVar56 = (pIVar40->field_1).r;
              uVar31 = (ushort)bVar56;
              uVar26 = (uint)local_518;
              uVar34 = local_528._0_4_;
            }
          }
          uVar44 = (uint)uVar16;
          if (uVar31 == uVar16) {
            local_508._168_4_ = local_508._168_4_ | 1 << ((byte)uVar16 & 0x1f);
          }
          else if (uVar16 < 0x100) {
            if ((-1 < (char)bVar56) || (*(char *)(uVar12 + lVar28 + 7) != '\0')) {
              *(short *)((long)&local_138 + (ulong)uVar44 * 2) = (short)uVar35;
              local_520 = local_520 | 1 << (uVar44 & 0x1f);
            }
          }
          else if (-1 < (char)bVar56) {
            local_51c = 1;
          }
          bVar56 = (byte)uVar16 & 0x1f;
          uVar48 = -2 << bVar56 | 0xfffffffeU >> 0x20 - bVar56;
          if (0xff < uVar44) {
            uVar48 = 0xffffffff;
          }
          uVar26 = uVar26 & uVar48;
          uVar44 = (int)uVar35 - 1;
          uVar35 = (ulong)uVar44;
          puVar29 = puVar29 + -1;
          lVar28 = lVar28 + -8;
        } while (0x8000 < uVar44);
        local_518 = CONCAT44(local_518._4_4_,uVar26);
        bVar61 = (int)local_178 == 0;
        pIVar40 = local_510;
        iVar43 = local_51c;
      }
      uVar44 = local_448 * 4 + 4 & 0xfffffff0;
      if ((int)local_448 < 3) {
        uVar44 = 0;
      }
      uVar26 = uVar44 - local_3f0->spadjust;
      uVar35 = 0;
      if (0 < (int)uVar26) {
        uVar35 = (ulong)uVar26;
      }
      if ((int)uVar26 < 0) {
        uVar44 = (uint)local_3f0->spadjust;
      }
      local_3f8->spadjust = (uint16_t)uVar44;
      if ((!bVar61) && (uVar42 = (ulong)local_43c, 0x8000 < uVar42)) {
        local_16c = uVar26;
        local_158 = uVar35;
        puVar29 = auStack_10372 + uVar42;
        lVar28 = uVar42 << 3;
        local_51c = iVar43;
        local_510 = pIVar40;
        do {
          uVar12 = local_508._144_8_;
          bVar56 = *(byte *)(local_508._144_8_ + lVar28 + 4);
          if ((bVar56 & 0x20) != 0) {
            *(byte *)(local_508._144_8_ + lVar28 + 4) = bVar56 & 0xdf;
            uVar16 = *puVar29;
            if (uVar16 < 0x100) {
              *(byte *)(local_508._144_8_ + lVar28 + 6) = (byte)uVar16 | 0x80;
            }
            else if ((int)local_158 + (uint)(uVar16 >> 8) * 4 ==
                     (uint)*(byte *)(local_508._144_8_ + lVar28 + 7) << 2) goto LAB_0013b2be;
            uVar44 = 0xffff0000;
            if (1 < (byte)((bVar56 & 0x1f) - 0xd)) {
              uVar44 = 0xbfef;
            }
            local_528.field_1.op12 = uVar34;
            if ((uVar44 & uVar34) == 0) goto LAB_0013b87f;
            local_178 = (IRIns *)(local_508._144_8_ + lVar28);
            pcStack_530 = (code *)0x13b237;
            RVar25 = ra_allocref((ASMState *)local_508,(IRRef)uVar42,uVar44 & uVar34);
            pcStack_530 = (code *)0x13b25d;
            emit_storeofs((ASMState *)local_508,local_178,RVar25,4,
                          (uint)*(byte *)(uVar12 + lVar28 + 7) << 2);
            bVar56 = (byte)RVar25 & 0x1f;
            if (RVar25 == uVar16) {
              local_508._168_4_ = local_508._168_4_ | 1 << ((byte)RVar25 & 0x1f);
              uVar44 = local_520 & (-2 << bVar56 | 0xfffffffeU >> 0x20 - bVar56);
            }
            else {
              uVar44 = local_520;
              if (0xff < uVar16) {
                local_51c = 1;
              }
            }
            if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_0013b6a3;
            uVar34 = local_528._0_4_ & ~(1 << (RVar25 & 0x1f));
            local_520 = uVar44;
          }
LAB_0013b2be:
          uVar44 = (IRRef)uVar42 - 1;
          uVar42 = (ulong)uVar44;
          puVar29 = puVar29 + -1;
          lVar28 = lVar28 + -8;
          pIVar40 = local_510;
          uVar35 = local_158;
          iVar43 = local_51c;
          uVar26 = local_16c;
        } while (0x8000 < uVar44);
      }
      *(uint *)(local_508._128_8_ + -4) = (uint)local_3f8->traceno;
      local_508._128_8_ = local_508._128_8_ + -4;
      pcStack_530 = (code *)0x13b336;
      emit_rma((ASMState *)local_508,XO_MOVmi,0,
               &((jit_State *)(local_508._152_8_ + -0xc28))->penalty[0x2e].val);
      if (0 < (int)uVar26) {
        if (uVar26 < 0x81) {
          *(byte *)(local_508._128_8_ + -1) = (byte)-(int)uVar35;
          local_508._128_8_ = local_508._128_8_ + -1;
          uVar27 = 0x830000fe;
        }
        else {
          *(int *)(local_508._128_8_ + -4) = -(int)uVar35;
          local_508._128_8_ = local_508._128_8_ + -4;
          uVar27 = 0x810000fe;
        }
        *(byte *)(local_508._128_8_ + -1) = 0xc4;
        *(undefined4 *)(local_508._128_8_ + -5) = uVar27;
        *(byte *)(local_508._128_8_ + -3) = 0x48;
        local_508._128_8_ = (byte *)(local_508._128_8_ + -3);
      }
      if (iVar43 != 0) {
        if ((local_508._168_4_ & 0xffffbfef) != 0xffffbfef) {
          uVar44 = local_508._168_4_ & 0xffffbfef ^ 0xffffbfef;
          do {
            uVar26 = 0;
            if (uVar44 != 0) {
              for (; (uVar44 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
              }
            }
            if (0xff < local_370[*(ushort *)(local_508 + (ulong)uVar26 * 4) - 0x8001]) {
              local_508._168_4_ = local_508._168_4_ | 1 << ((byte)uVar26 & 0x1f);
              pcStack_530 = (code *)0x13b3f5;
              emit_loadofs((ASMState *)local_508,
                           (IRIns *)(local_508._144_8_ +
                                    (ulong)*(ushort *)(local_508 + (ulong)uVar26 * 4) * 8),uVar26,4,
                           local_370[*(ushort *)(local_508 + (ulong)uVar26 * 4) - 0x8001] >> 6 &
                           0xfffffffc);
              if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_0013b6a3;
            }
            uVar44 = uVar44 & ~(1 << (uVar26 & 0x1f));
          } while (uVar44 != 0);
        }
      }
      local_510 = pIVar40 + 0x8000;
      uVar44 = local_520;
      do {
        uVar26 = uVar44 & 0xbfef;
        local_528.field_1.op12 = uVar34;
        local_520 = 0;
        if (uVar26 != 0) {
          for (; (uVar26 >> local_520 & 1) == 0; local_520 = local_520 + 1) {
          }
        }
        uVar48 = uVar44 & 0xffff0000;
        RVar25 = 0;
        if (uVar48 != 0) {
          for (; (uVar48 >> RVar25 & 1) == 0; RVar25 = RVar25 + 1) {
          }
        }
        while( true ) {
          uVar57 = local_508._168_4_ & uVar44;
          if (uVar57 != 0) break;
          if (uVar44 == 0) {
            bVar56 = local_3f0->topslot;
            local_3f8->topslot = bVar56;
            if (bVar56 < (BCReg)local_404) {
              exitno = *(ExitNo *)(local_508._152_8_ + 0xbcc);
              local_3f8->topslot = (uint8_t)local_404;
              pcStack_530 = (code *)0x13b56e;
              asm_stack_check((ASMState *)local_508,(BCReg)local_404,local_510,(uint)local_518,
                              exitno);
            }
            goto LAB_0013b5a5;
          }
          if (uVar26 != 0) {
            uVar57 = local_508._168_4_ & (uVar26 ^ 0xbfef) & uVar34;
            if (uVar57 == 0) goto LAB_0013b87f;
            RVar19 = 0;
            if (uVar57 != 0) {
              for (; (uVar57 >> RVar19 & 1) == 0; RVar19 = RVar19 + 1) {
              }
            }
            pcStack_530 = (code *)0x13b489;
            ra_rename((ASMState *)local_508,local_520,RVar19);
          }
          if (uVar48 != 0) {
            uVar57 = local_508._168_4_ & (uVar48 ^ 0xffff0000) & local_528._0_4_;
            if (uVar57 == 0) goto LAB_0013b87f;
            RVar19 = 0;
            if (uVar57 != 0) {
              for (; (uVar57 >> RVar19 & 1) == 0; RVar19 = RVar19 + 1) {
              }
            }
            pcStack_530 = (code *)0x13b4b3;
            ra_rename((ASMState *)local_508,RVar25,RVar19);
          }
          if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_0013b6a3;
        }
        uVar26 = 0;
        if (uVar57 != 0) {
          for (; (uVar57 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
          }
        }
        pIVar40 = (IRIns *)(local_508._144_8_ +
                           (ulong)*(ushort *)((long)&local_138 + (ulong)uVar26 * 2) * 8);
        uVar44 = uVar44 & ~(1 << (uVar26 & 0x1f));
        uVar34 = local_528._0_4_ & ~(1 << (uVar26 & 0x1f));
        local_508._168_4_ = local_508._168_4_ | 1 << ((pIVar40->field_1).r & 0x1f);
        pcStack_530 = (code *)0x13b50b;
        emit_movrr((ASMState *)local_508,pIVar40,(uint)(pIVar40->field_1).r,uVar26);
      } while ((ulong)local_508._136_8_ <= (ulong)local_508._128_8_);
      goto LAB_0013b6a3;
    }
    bVar56 = *(byte *)(local_508._144_8_ + 0x40006);
    if (-1 < (char)bVar56) {
      local_508._168_4_ = local_508._168_4_ | 1 << (bVar56 & 0x1f);
      auVar14 = stack0xfffffffffffffba0;
      RStack_45c = auVar13._4_4_;
      if (((RStack_45c >> ((int)(char)bVar56 & 0x1fU) & 1) != 0) ||
         ((*(byte *)(local_508._144_8_ + 0x40004) & 0x20) != 0)) {
        *(undefined1 *)(local_508._144_8_ + 0x40006) = 0xff;
      }
      unique0x10004c4c = auVar14;
      if (bVar56 != 2) {
        *(byte *)(local_508._128_8_ + -1) = bVar56 * '\b' | 0xc2;
        *(byte *)(local_508._128_8_ + -2) = 0x8b;
        *(byte *)(local_508._128_8_ + -3) = bVar56 >> 1 & 4 | 0x48;
        local_508._128_8_ = local_508._128_8_ + -3;
      }
    }
    *(uint *)(local_508._128_8_ + -4) = (uint)local_3f8->traceno;
    local_508._128_8_ = local_508._128_8_ + -4;
    pcStack_530 = (code *)0x13aed5;
    emit_rma((ASMState *)local_508,XO_MOVmi,0,
             &((jit_State *)(local_508._152_8_ + -0xc28))->penalty[0x2e].val);
    uVar44 = local_448 * 4 + 4 & 0xfffffff0;
    if ((int)local_448 < 3) {
      uVar44 = 0;
    }
    local_3f8->spadjust = (uint16_t)uVar44;
    if (uVar44 != 0) {
      if (uVar44 + 0x7f < 0x100) {
        *(byte *)(local_508._128_8_ + -1) = (byte)-uVar44;
        local_508._128_8_ = local_508._128_8_ + -1;
        uVar34 = 0x830000fe;
      }
      else {
        *(uint *)(local_508._128_8_ + -4) = -uVar44;
        local_508._128_8_ = local_508._128_8_ + -4;
        uVar34 = 0x810000fe;
      }
      *(byte *)(local_508._128_8_ + -1) = 0xc4;
      *(undefined4 *)(local_508._128_8_ + -5) = uVar34;
      *(byte *)(local_508._128_8_ + -3) = 0x48;
      local_508._128_8_ = (byte *)(local_508._128_8_ + -3);
    }
    local_3f8->topslot = *(uint8_t *)((local_3f8->startpt).gcptr64 + 0xb);
LAB_0013b5a5:
    J = local_150;
    pGVar21 = local_148;
    for (uVar44 = uStack_454; local_150 = J, local_148 = pGVar21, uVar44 != 0;
        uVar44 = uVar44 & (-2 << bVar59 | 0xfffffffeU >> 0x20 - bVar59)) {
      uVar48 = uVar44 >> 0x18 | (uVar44 & 0xff0000) >> 8 | (uVar44 & 0xff00) << 8 | uVar44 << 0x18;
      uVar26 = 0x1f;
      if (uVar48 != 0) {
        for (; uVar48 >> uVar26 == 0; uVar26 = uVar26 - 1) {
        }
      }
      uVar16 = *(ushort *)(local_3b0 + (ulong)(uVar26 ^ 0x18) * 2);
      uVar35 = (ulong)uVar16;
      bVar56 = *(byte *)(local_508._144_8_ + uVar35 * 8 + 4);
      bVar59 = (byte)(uVar26 ^ 0x18);
      if (((bVar56 & 0x20) != 0) &&
         (*(byte *)(local_508._144_8_ + uVar35 * 8 + 4) = bVar56 & 0xdf,
         *(char *)(local_508._144_8_ + uVar35 * 8 + 7) != '\0')) {
        (((jit_State *)local_508._152_8_)->fold).ins.field_0.ot = 0x1400;
        (((jit_State *)local_508._152_8_)->fold).ins.field_0.op1 = uVar16;
        (((jit_State *)local_508._152_8_)->fold).ins.field_0.op2 = (IRRef1)local_428;
        pcStack_530 = (code *)0x13b611;
        TVar20 = lj_ir_emit((jit_State *)local_508._152_8_);
        uVar35 = (ulong)((TVar20 & 0xffff) << 3);
        *(byte *)((long)((GCtrace *)local_508._152_8_)->ir + uVar35 + 6) = bVar59;
        *(undefined1 *)((long)((GCtrace *)local_508._152_8_)->ir + uVar35 + 7) = 0;
      }
      bVar59 = bVar59 & 0x1f;
      J = local_150;
      pGVar21 = local_148;
    }
    T_00 = J->curfinal;
    if (pGVar21->nins <= T_00->nins) {
      pcStack_530 = (code *)0x13b6d5;
      memcpy(T_00->ir + local_438,pGVar21->ir + local_438,(ulong)(pGVar21->nins - local_438) << 3);
      pGVar21->nins = J->curfinal->nins;
      local_440 = 0x8001;
      pcStack_530 = (code *)0x13b6f2;
      asm_snap_prev((ASMState *)local_508);
      if (local_508._168_4_ == 0xffffbfef) {
        pGVar21->mcode = (MCode *)local_508._128_8_;
        MVar50 = 0;
        if (local_3d0 != (byte *)0x0) {
          MVar50 = (int)local_3d0 - (int)local_508._128_8_;
        }
        pGVar21->mcloop = MVar50;
        pbVar39 = local_3e0;
        if (local_408 == 0) {
          uVar16 = pGVar21->link;
          uVar31 = local_3f8->spadjust;
          if (uVar31 == 0) {
            pbVar39 = local_3e0 + -7;
          }
          else {
            if ((uint)uVar31 == (int)(char)(byte)uVar31) {
              local_3e0[-9] = (byte)uVar31;
              bVar56 = 0x83;
              pbVar39 = local_3e0 + -3;
            }
            else {
              *(uint *)(local_3e0 + -9) = (uint)uVar31;
              bVar56 = 0x81;
            }
            local_3e0[-0xc] = 0x48;
            local_3e0[-0xb] = bVar56;
            local_3e0[-10] = 0xc4;
          }
          if ((ulong)uVar16 == 0) {
            iVar43 = 0x12efd5;
          }
          else {
            iVar43 = (int)*(undefined8 *)
                           ((*(GCRef **)(local_508._152_8_ + 0x180))[uVar16].gcptr64 + 0x58);
          }
          *(int *)(pbVar39 + -4) = iVar43 - (int)pbVar39;
          pbVar39[-5] = 0xe9;
          if (pbVar39 <= local_3e0 + -1) {
            pbVar37 = local_3e0 + -2;
            if (pbVar39 + -1 < local_3e0 + -2) {
              pbVar37 = pbVar39 + -1;
            }
            pcStack_530 = (code *)0x13b7e5;
            memset(pbVar37 + 1,0x90,(size_t)(local_3e0 + ~(ulong)pbVar37));
          }
        }
        local_3e0 = pbVar39;
        pGVar21->szmcode = (int)local_3e0 - (int)local_508._128_8_;
        pSVar6 = local_3f8->snap;
        uVar44 = local_3f8->nsnap - 1;
        if (uVar44 != 0) {
          uVar35 = (ulong)uVar44;
          puVar51 = &pSVar6[uVar35].mcofs;
          do {
            uVar35 = uVar35 - 1;
            *puVar51 = ((short)local_3d8 - (short)local_508._128_8_) -
                       pSVar6[uVar35 & 0xffffffff].mcofs;
            puVar51 = puVar51 + -6;
          } while ((int)uVar35 != 0);
        }
        pSVar6->mcofs = 0;
        pcStack_530 = (code *)0x13b860;
        lj_mcode_sync(pGVar21->mcode,local_3d8);
        return;
      }
      pcStack_530 = asm_snap_prev;
      lj_trace_err((jit_State *)local_508._152_8_,LJ_TRERR_BADRA);
    }
    pcStack_530 = (code *)0x13b673;
    lj_trace_free(local_140,T_00);
    J->curfinal = (GCtrace *)0x0;
    pcStack_530 = (code *)0x13b688;
    pGVar21 = lj_trace_alloc(J->L,pGVar21);
    J->curfinal = pGVar21;
    local_3b8 = (byte *)0x0;
  }
  goto LAB_0013654a;
}

Assistant:

void lj_asm_trace(jit_State *J, GCtrace *T)
{
  ASMState as_;
  ASMState *as = &as_;

  /* Remove nops/renames left over from ASM restart due to LJ_TRERR_MCODELM. */
  {
    IRRef nins = T->nins;
    IRIns *ir = &T->ir[nins-1];
    if (ir->o == IR_NOP || ir->o == IR_RENAME) {
      do { ir--; nins--; } while (ir->o == IR_NOP || ir->o == IR_RENAME);
      T->nins = nins;
    }
  }

  /* Ensure an initialized instruction beyond the last one for HIOP checks. */
  /* This also allows one RENAME to be added without reallocating curfinal. */
  as->orignins = lj_ir_nextins(J);
  lj_ir_nop(&J->cur.ir[as->orignins]);

  /* Setup initial state. Copy some fields to reduce indirections. */
  as->J = J;
  as->T = T;
  J->curfinal = lj_trace_alloc(J->L, T);  /* This copies the IR, too. */
  as->flags = J->flags;
  as->loopref = J->loopref;
  as->realign = NULL;
  as->loopinv = 0;
  as->parent = J->parent ? traceref(J, J->parent) : NULL;
#ifdef LUAJIT_RANDOM_RA
  (void)lj_prng_u64(&J2G(J)->prng);  /* Ensure PRNG step between traces. */
#endif

  /* Reserve MCode memory. */
  as->mctop = as->mctoporig = lj_mcode_reserve(J, &as->mcbot);
  as->mcp = as->mctop;
  as->mclim = as->mcbot + MCLIM_REDZONE;
  asm_setup_target(as);

  /*
  ** This is a loop, because the MCode may have to be (re-)assembled
  ** multiple times:
  **
  ** 1. as->realign is set (and the assembly aborted), if the arch-specific
  **    backend wants the MCode to be aligned differently.
  **
  **    This is currently only the case on x86/x64, where small loops get
  **    an aligned loop body plus a short branch. Not much effort is wasted,
  **    because the abort happens very quickly and only once.
  **
  ** 2. The IR is immovable, since the MCode embeds pointers to various
  **    constants inside the IR. But RENAMEs may need to be added to the IR
  **    during assembly, which might grow and reallocate the IR. We check
  **    at the end if the IR (in J->cur.ir) has actually grown, resize the
  **    copy (in J->curfinal.ir) and try again.
  **
  **    95% of all traces have zero RENAMEs, 3% have one RENAME, 1.5% have
  **    2 RENAMEs and only 0.5% have more than that. That's why we opt to
  **    always have one spare slot in the IR (see above), which means we
  **    have to redo the assembly for only ~2% of all traces.
  **
  **    Very, very rarely, this needs to be done repeatedly, since the
  **    location of constants inside the IR (actually, reachability from
  **    a global pointer) may affect register allocation and thus the
  **    number of RENAMEs.
  */
  for (;;) {
    as->mcp = as->mctop;
#ifdef LUA_USE_ASSERT
    as->mcp_prev = as->mcp;
#endif
    as->ir = J->curfinal->ir;  /* Use the copied IR. */
    as->curins = J->cur.nins = as->orignins;
#ifdef LUAJIT_RANDOM_RA
    as->prngstate = J2G(J)->prng;  /* Must (re)start from identical state. */
    as->prngbits = 0;
#endif

    RA_DBG_START();
    RA_DBGX((as, "===== STOP ====="));

    /* General trace setup. Emit tail of trace. */
    asm_tail_prep(as);
    as->mcloop = NULL;
    as->flagmcp = NULL;
    as->topslot = 0;
    as->gcsteps = 0;
    as->sectref = as->loopref;
    as->fuseref = (as->flags & JIT_F_OPT_FUSE) ? as->loopref : FUSE_DISABLED;
    asm_setup_regsp(as);
    if (!as->loopref)
      asm_tail_link(as);

    /* Assemble a trace in linear backwards order. */
    for (as->curins--; as->curins > as->stopins; as->curins--) {
      IRIns *ir = IR(as->curins);
      /* 64 bit types handled by SPLIT for 32 bit archs. */
      lj_assertA(!(LJ_32 && irt_isint64(ir->t)),
		 "IR %04d has unsplit 64 bit type",
		 (int)(ir - as->ir) - REF_BIAS);
      asm_snap_prev(as);
      if (!ra_used(ir) && !ir_sideeff(ir) && (as->flags & JIT_F_OPT_DCE))
	continue;  /* Dead-code elimination can be soooo easy. */
      if (irt_isguard(ir->t))
	asm_snap_prep(as);
      RA_DBG_REF();
      checkmclim(as);
      asm_ir(as, ir);
    }

    if (as->realign && J->curfinal->nins >= T->nins)
      continue;  /* Retry in case only the MCode needs to be realigned. */

    /* Emit head of trace. */
    RA_DBG_REF();
    checkmclim(as);
    if (as->gcsteps > 0) {
      as->curins = as->T->snap[0].ref;
      asm_snap_prep(as);  /* The GC check is a guard. */
      asm_gc_check(as);
      as->curins = as->stopins;
    }
    ra_evictk(as);
    if (as->parent)
      asm_head_side(as);
    else
      asm_head_root(as);
    asm_phi_fixup(as);

    if (J->curfinal->nins >= T->nins) {  /* IR didn't grow? */
      lj_assertA(J->curfinal->nk == T->nk, "unexpected IR constant growth");
      memcpy(J->curfinal->ir + as->orignins, T->ir + as->orignins,
	     (T->nins - as->orignins) * sizeof(IRIns));  /* Copy RENAMEs. */
      T->nins = J->curfinal->nins;
      /* Fill mcofs of any unprocessed snapshots. */
      as->curins = REF_FIRST;
      asm_snap_prev(as);
      break;  /* Done. */
    }

    /* Otherwise try again with a bigger IR. */
    lj_trace_free(J2G(J), J->curfinal);
    J->curfinal = NULL;  /* In case lj_trace_alloc() OOMs. */
    J->curfinal = lj_trace_alloc(J->L, T);
    as->realign = NULL;
  }

  RA_DBGX((as, "===== START ===="));
  RA_DBG_FLUSH();
  if (as->freeset != RSET_ALL)
    lj_trace_err(as->J, LJ_TRERR_BADRA);  /* Ouch! Should never happen. */

  /* Set trace entry point before fixing up tail to allow link to self. */
  T->mcode = as->mcp;
  T->mcloop = as->mcloop ? (MSize)((char *)as->mcloop - (char *)as->mcp) : 0;
  if (as->loopref)
    asm_loop_tail_fixup(as);
  else
    asm_tail_fixup(as, T->link);  /* Note: this may change as->mctop! */
  T->szmcode = (MSize)((char *)as->mctop - (char *)as->mcp);
  asm_snap_fixup_mcofs(as);
#if LJ_TARGET_MCODE_FIXUP
  asm_mcode_fixup(T->mcode, T->szmcode);
#endif
  lj_mcode_sync(T->mcode, as->mctoporig);
}